

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_key(CImgDisplay *this,uint keycode,bool pressed)

{
  CImgDisplay *pCVar1;
  
  if ((int)keycode < 0xff1b) {
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x20:
        goto switchD_0012f0d2_caseD_20;
      default:
        goto switchD_0012f06f_caseD_ffac;
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      case 0x31:
        goto switchD_0012f775_caseD_31;
      case 0x32:
        goto switchD_0012f775_caseD_32;
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      case 0x61:
        goto switchD_0012f160_caseD_61;
      case 0x62:
        goto switchD_0012f160_caseD_62;
      case 99:
        goto switchD_0012f160_caseD_63;
      case 100:
        goto switchD_0012f160_caseD_64;
      case 0x65:
        goto switchD_0012f160_caseD_65;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      case 0x6b:
        goto switchD_0012f160_caseD_6b;
      case 0x6c:
        goto switchD_0012f160_caseD_6c;
      case 0x6d:
        goto switchD_0012f160_caseD_6d;
      case 0x6e:
        goto switchD_0012f160_caseD_6e;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x71:
        goto switchD_0012f160_caseD_71;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x73:
        goto switchD_0012f160_caseD_73;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x76:
        goto switchD_0012f160_caseD_76;
      case 0x77:
        goto switchD_0012f160_caseD_77;
      case 0x78:
        goto switchD_0012f160_caseD_78;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      case 0x7a:
        goto switchD_0012f160_caseD_7a;
      }
    }
    if ((int)keycode < 0xff0d) {
      if (keycode == 0xff08) goto LAB_0012faf4;
      if (keycode != 0xff09) goto switchD_0012f06f_caseD_ffac;
      goto LAB_0012f136;
    }
    if (keycode != 0xff0d) {
      if (keycode != 0xff13) goto switchD_0012f06f_caseD_ffac;
      goto LAB_0012f754;
    }
    goto LAB_001307c0;
  }
  switch(keycode) {
  case 0xffaa:
    goto switchD_0012f06f_caseD_ffaa;
  case 0xffab:
    goto switchD_0012f06f_caseD_ffab;
  case 0xffac:
  case 0xffae:
  case 0xffba:
  case 0xffbb:
  case 0xffbc:
  case 0xffbd:
  case 0xffca:
  case 0xffcb:
  case 0xffcc:
  case 0xffcd:
  case 0xffce:
  case 0xffcf:
  case 0xffd0:
  case 0xffd1:
  case 0xffd2:
  case 0xffd3:
  case 0xffd4:
  case 0xffd5:
  case 0xffd6:
  case 0xffd7:
  case 0xffd8:
  case 0xffd9:
  case 0xffda:
  case 0xffdb:
  case 0xffdc:
  case 0xffdd:
  case 0xffde:
  case 0xffdf:
  case 0xffe0:
  case 0xffe6:
  case 0xffe7:
  case 0xffe8:
  case 0xffed:
  case 0xffee:
  case 0xffef:
  case 0xfff0:
  case 0xfff1:
  case 0xfff2:
  case 0xfff3:
  case 0xfff4:
  case 0xfff5:
  case 0xfff6:
  case 0xfff7:
  case 0xfff8:
  case 0xfff9:
  case 0xfffa:
  case 0xfffb:
  case 0xfffc:
  case 0xfffd:
  case 0xfffe:
    goto switchD_0012f06f_caseD_ffac;
  case 0xffad:
    goto switchD_0012f06f_caseD_ffad;
  case 0xffaf:
    goto switchD_0012f06f_caseD_ffaf;
  case 0xffb0:
    goto switchD_0012f06f_caseD_ffb0;
  case 0xffb1:
    goto switchD_0012f06f_caseD_ffb1;
  case 0xffb2:
    goto switchD_0012f06f_caseD_ffb2;
  case 0xffb3:
    goto switchD_0012f06f_caseD_ffb3;
  case 0xffb4:
    goto switchD_0012f06f_caseD_ffb4;
  case 0xffb5:
    goto switchD_0012f06f_caseD_ffb5;
  case 0xffb6:
    goto switchD_0012f06f_caseD_ffb6;
  case 0xffb7:
    goto switchD_0012f06f_caseD_ffb7;
  case 0xffb8:
    goto switchD_0012f06f_caseD_ffb8;
  case 0xffb9:
    goto switchD_0012f06f_caseD_ffb9;
  case 0xffbe:
    this->_is_keyF1 = pressed;
    if (0xff08 < (int)keycode) {
      if ((int)keycode < 0xffbf) {
        if ((int)keycode < 0xff50) {
          if (keycode == 0xff09) goto LAB_0012f136;
          if (keycode == 0xff13) goto LAB_0012f754;
        }
        else {
          switch(keycode) {
          case 0xff50:
            goto switchD_0012f111_caseD_0;
          case 0xff51:
          case 0xff52:
          case 0xff53:
          case 0xff54:
            break;
          case 0xff55:
            goto switchD_0012f111_caseD_5;
          case 0xff56:
            goto switchD_0012f111_caseD_6;
          case 0xff57:
            goto switchD_0012f111_caseD_7;
          default:
            if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
          }
        }
        goto switchD_0012f570_caseD_62;
      }
      switch(keycode) {
      case 0xffbf:
        goto switchD_0012f06f_caseD_ffbf;
      case 0xffc0:
        goto switchD_0012f06f_caseD_ffc0;
      case 0xffc1:
        goto switchD_0012f06f_caseD_ffc1;
      case 0xffc2:
        goto switchD_0012f06f_caseD_ffc2;
      case 0xffc3:
        goto switchD_0012f06f_caseD_ffc3;
      case 0xffc4:
        goto switchD_0012f06f_caseD_ffc4;
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      }
      goto switchD_0012f212_default;
    }
    switch(keycode) {
    case 0x61:
      goto switchD_0012f160_caseD_61;
    case 0x62:
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x73:
    case 0x76:
    case 0x78:
      break;
    case 0x65:
      goto switchD_0012f160_caseD_65;
    case 0x69:
      goto switchD_0012f160_caseD_69;
    case 0x6f:
      goto switchD_0012f160_caseD_6f;
    case 0x70:
      goto switchD_0012f160_caseD_70;
    case 0x71:
      goto switchD_0012f160_caseD_71;
    case 0x72:
      goto switchD_0012f160_caseD_72;
    case 0x74:
      goto switchD_0012f160_caseD_74;
    case 0x75:
      goto switchD_0012f160_caseD_75;
    case 0x77:
      goto switchD_0012f160_caseD_77;
    case 0x79:
      goto switchD_0012f160_caseD_79;
    default:
      switch(keycode) {
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      case 0x31:
        goto switchD_0012f775_caseD_31;
      case 0x32:
        goto switchD_0012f775_caseD_32;
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      default:
        if (keycode == 0xff08) goto LAB_0012faf4;
      }
    }
    goto switchD_0012f570_caseD_62;
  case 0xffbf:
switchD_0012f06f_caseD_ffbf:
    this->_is_keyF2 = pressed;
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      case 0x31:
        goto switchD_0012f775_caseD_31;
      case 0x32:
        goto switchD_0012f775_caseD_32;
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      default:
        switch(keycode) {
        case 0x71:
          goto switchD_0012f160_caseD_71;
        case 0x72:
          goto switchD_0012f160_caseD_72;
        case 0x73:
        case 0x75:
        case 0x76:
        case 0x78:
          break;
        case 0x74:
          goto switchD_0012f160_caseD_74;
        case 0x77:
          goto switchD_0012f160_caseD_77;
        case 0x79:
          goto switchD_0012f160_caseD_79;
        default:
          if (keycode == 0x65) goto switchD_0012f160_caseD_65;
        }
      }
    }
    else if ((int)keycode < 0xff55) {
      if ((int)keycode < 0xff13) {
        if (keycode == 0xff08) goto LAB_0012faf4;
        if (keycode == 0xff09) goto LAB_0012f136;
      }
      else {
        if (keycode == 0xff13) goto LAB_0012f754;
        if (keycode == 0xff50) goto switchD_0012f111_caseD_0;
      }
    }
    else {
      switch(keycode) {
      case 0xffc0:
        goto switchD_0012f06f_caseD_ffc0;
      case 0xffc1:
        goto switchD_0012f06f_caseD_ffc1;
      case 0xffc2:
        goto switchD_0012f06f_caseD_ffc2;
      case 0xffc3:
        goto switchD_0012f06f_caseD_ffc3;
      case 0xffc4:
        goto switchD_0012f06f_caseD_ffc4;
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      default:
        if (keycode == 0xff55) goto switchD_0012f111_caseD_5;
        if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
      }
    }
    goto switchD_0012f59f_caseD_73;
  case 0xffc0:
switchD_0012f06f_caseD_ffc0:
    this->_is_keyF3 = pressed;
    if ((int)keycode < 0xff50) {
      if ((int)keycode < 0xff08) {
        switch(keycode) {
        case 0x30:
          goto switchD_0012f0d2_caseD_30;
        case 0x31:
          goto switchD_0012f775_caseD_31;
        case 0x32:
          goto switchD_0012f775_caseD_32;
        case 0x33:
          goto switchD_0012f775_caseD_33;
        case 0x34:
          goto switchD_0012f775_caseD_34;
        case 0x35:
          goto switchD_0012f775_caseD_35;
        case 0x36:
          goto switchD_0012f775_caseD_36;
        case 0x37:
          goto switchD_0012f775_caseD_37;
        case 0x38:
          goto switchD_0012f775_caseD_38;
        case 0x39:
          goto switchD_0012f0d2_caseD_39;
        }
      }
      else {
        if (keycode == 0xff08) goto LAB_0012faf4;
        if (keycode == 0xff09) goto LAB_0012f136;
        if (keycode == 0xff13) goto LAB_0012f754;
      }
    }
    else if ((int)keycode < 0xffc1) {
      if (keycode == 0xff50) goto switchD_0012f111_caseD_0;
      if (keycode == 0xff55) goto switchD_0012f111_caseD_5;
      if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
    }
    else {
      switch(keycode) {
      case 0xffc1:
        goto switchD_0012f06f_caseD_ffc1;
      case 0xffc2:
        goto switchD_0012f06f_caseD_ffc2;
      case 0xffc3:
        goto switchD_0012f06f_caseD_ffc3;
      case 0xffc4:
        goto switchD_0012f06f_caseD_ffc4;
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      }
    }
    goto switchD_0012f2d1_default;
  case 0xffc1:
switchD_0012f06f_caseD_ffc1:
    this->_is_keyF4 = pressed;
    if (0xff12 < (int)keycode) {
      switch(keycode) {
      case 0xffc2:
        goto switchD_0012f06f_caseD_ffc2;
      case 0xffc3:
        goto switchD_0012f06f_caseD_ffc3;
      case 0xffc4:
        goto switchD_0012f06f_caseD_ffc4;
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0012f754;
      }
      goto LAB_0012f88e;
    }
    switch(keycode) {
    case 0x30:
      goto switchD_0012f0d2_caseD_30;
    case 0x31:
      goto switchD_0012f775_caseD_31;
    case 0x32:
      goto switchD_0012f775_caseD_32;
    case 0x33:
      goto switchD_0012f775_caseD_33;
    case 0x34:
      goto switchD_0012f775_caseD_34;
    case 0x35:
      goto switchD_0012f775_caseD_35;
    case 0x36:
      goto switchD_0012f775_caseD_36;
    case 0x37:
      goto switchD_0012f775_caseD_37;
    case 0x38:
      goto switchD_0012f775_caseD_38;
    case 0x39:
      goto switchD_0012f0d2_caseD_39;
    default:
      if (keycode == 0xff08) goto LAB_0012faf4;
    }
    goto switchD_0012f820_caseD_31;
  case 0xffc2:
switchD_0012f06f_caseD_ffc2:
    this->_is_keyF5 = pressed;
    switch(keycode) {
    case 0x30:
      goto switchD_0012f0d2_caseD_30;
    case 0x31:
      goto switchD_0012f775_caseD_31;
    case 0x32:
      goto switchD_0012f775_caseD_32;
    case 0x33:
      goto switchD_0012f775_caseD_33;
    case 0x34:
      goto switchD_0012f775_caseD_34;
    case 0x35:
      goto switchD_0012f775_caseD_35;
    case 0x36:
      goto switchD_0012f775_caseD_36;
    case 0x37:
      goto switchD_0012f775_caseD_37;
    case 0x38:
      goto switchD_0012f775_caseD_38;
    case 0x39:
      goto switchD_0012f0d2_caseD_39;
    default:
      switch(keycode) {
      case 0xffc3:
        goto switchD_0012f06f_caseD_ffc3;
      case 0xffc4:
        goto switchD_0012f06f_caseD_ffc4;
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0012f754;
      }
    }
    goto switchD_0012f7de_caseD_31;
  case 0xffc3:
switchD_0012f06f_caseD_ffc3:
    this->_is_keyF6 = pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0012f775_caseD_31;
    case 0x32:
      goto switchD_0012f775_caseD_32;
    case 0x33:
      goto switchD_0012f775_caseD_33;
    case 0x34:
      goto switchD_0012f775_caseD_34;
    case 0x35:
      goto switchD_0012f775_caseD_35;
    case 0x36:
      goto switchD_0012f775_caseD_36;
    case 0x37:
      goto switchD_0012f775_caseD_37;
    case 0x38:
      goto switchD_0012f775_caseD_38;
    case 0x39:
      goto switchD_0012f0d2_caseD_39;
    default:
      switch(keycode) {
      case 0xffc4:
        goto switchD_0012f06f_caseD_ffc4;
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0012f754;
      }
    }
    goto switchD_0012f798_default;
  case 0xffc4:
switchD_0012f06f_caseD_ffc4:
    this->_is_keyF7 = pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0012f775_caseD_31;
    case 0x32:
      goto switchD_0012f775_caseD_32;
    case 0x33:
      goto switchD_0012f775_caseD_33;
    case 0x34:
      goto switchD_0012f775_caseD_34;
    case 0x35:
      goto switchD_0012f775_caseD_35;
    case 0x36:
      goto switchD_0012f775_caseD_36;
    case 0x37:
      goto switchD_0012f775_caseD_37;
    case 0x38:
      goto switchD_0012f775_caseD_38;
    default:
      switch(keycode) {
      case 0xffc5:
        goto switchD_0012f06f_caseD_ffc5;
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      }
      goto switchD_0012f54e_default;
    }
  case 0xffc5:
switchD_0012f06f_caseD_ffc5:
    this->_is_keyF8 = pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0012f775_caseD_31;
    case 0x32:
      goto switchD_0012f775_caseD_32;
    case 0x33:
      goto switchD_0012f775_caseD_33;
    case 0x34:
      goto switchD_0012f775_caseD_34;
    case 0x35:
      goto switchD_0012f775_caseD_35;
    case 0x36:
      goto switchD_0012f775_caseD_36;
    case 0x37:
      goto switchD_0012f775_caseD_37;
    default:
      switch(keycode) {
      case 0xffc6:
        goto switchD_0012f06f_caseD_ffc6;
      case 0xffc7:
        goto switchD_0012f06f_caseD_ffc7;
      case 0xffc8:
        goto switchD_0012f06f_caseD_ffc8;
      case 0xffc9:
        goto switchD_0012f06f_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0012f754;
        break;
      }
    }
  case 0xffc6:
switchD_0012f06f_caseD_ffc6:
    this->_is_keyF9 = pressed;
    if ((int)keycode < 0xff13) {
      switch(keycode) {
      case 0x31:
        goto switchD_0012f775_caseD_31;
      case 0x32:
        goto switchD_0012f775_caseD_32;
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      }
    }
    else {
      if (0xffc7 < (int)keycode) {
        if (keycode == 0xffc8) goto switchD_0012f06f_caseD_ffc8;
        goto LAB_0012f524;
      }
      if (keycode == 0xff13) goto LAB_0012f754;
      if (keycode == 0xffc7) goto switchD_0012f06f_caseD_ffc7;
    }
    break;
  case 0xffc7:
switchD_0012f06f_caseD_ffc7:
    this->_is_keyF10 = pressed;
    if ((int)keycode < 0xff13) {
      switch(keycode) {
      case 0x31:
        goto switchD_0012f775_caseD_31;
      case 0x32:
        goto switchD_0012f775_caseD_32;
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      }
    }
    else {
      if (keycode == 0xff13) goto LAB_0012f754;
      if (keycode == 0xffc9) goto switchD_0012f06f_caseD_ffc9;
      if (keycode == 0xffc8) goto switchD_0012f06f_caseD_ffc8;
    }
    break;
  case 0xffc8:
switchD_0012f06f_caseD_ffc8:
    this->_is_keyF11 = pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0012f775_caseD_31;
    case 0x32:
      goto switchD_0012f775_caseD_32;
    case 0x33:
      goto switchD_0012f775_caseD_33;
    case 0x34:
      goto switchD_0012f775_caseD_34;
    case 0x35:
      goto switchD_0012f775_caseD_35;
    case 0x36:
      goto switchD_0012f775_caseD_36;
    case 0x37:
      goto switchD_0012f775_caseD_37;
    default:
      if (keycode != 0xff13) {
LAB_0012f524:
        if (keycode == 0xffc9) goto switchD_0012f06f_caseD_ffc9;
        break;
      }
      goto LAB_0012f754;
    }
  case 0xffc9:
switchD_0012f06f_caseD_ffc9:
    this->_is_keyF12 = pressed;
    switch(keycode) {
    case 0x31:
switchD_0012f775_caseD_31:
      this->_is_key1 = pressed;
      switch(keycode) {
      case 0x32:
        goto switchD_0012f775_caseD_32;
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      default:
        goto switchD_0012f798_default;
      }
    case 0x32:
switchD_0012f775_caseD_32:
      this->_is_key2 = pressed;
      switch(keycode) {
      case 0x33:
        goto switchD_0012f775_caseD_33;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      }
      goto switchD_0012f798_default;
    case 0x33:
switchD_0012f775_caseD_33:
      this->_is_key3 = pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      default:
        goto switchD_0012f7de_caseD_31;
      case 0x34:
        goto switchD_0012f775_caseD_34;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      }
    case 0x34:
switchD_0012f775_caseD_34:
      this->_is_key4 = pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      case 0x35:
        goto switchD_0012f775_caseD_35;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      }
      goto switchD_0012f7de_caseD_31;
    case 0x35:
switchD_0012f775_caseD_35:
      this->_is_key5 = pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
        goto switchD_0012f801_caseD_31;
      case 0x36:
        goto switchD_0012f775_caseD_36;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      default:
        if (keycode != 0xff08) goto switchD_0012f801_caseD_31;
        goto LAB_0012faf4;
      }
    case 0x36:
switchD_0012f775_caseD_36:
      this->_is_key6 = pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0012f0d2_caseD_30;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
        goto switchD_0012f820_caseD_31;
      case 0x37:
        goto switchD_0012f775_caseD_37;
      case 0x38:
        goto switchD_0012f775_caseD_38;
      case 0x39:
        goto switchD_0012f0d2_caseD_39;
      default:
        if (keycode == 0xff08) goto LAB_0012faf4;
LAB_0012f88e:
        if (keycode != 0xff63) goto switchD_0012f820_caseD_31;
        goto switchD_0012f111_caseD_13;
      }
    case 0x37:
switchD_0012f775_caseD_37:
      this->_is_key7 = pressed;
      break;
    case 0x38:
      goto switchD_0012f775_caseD_38;
    default:
switchD_0012f54e_default:
      if (keycode == 0xff13) {
LAB_0012f754:
        this->_is_keyPAUSE = pressed;
        switch(keycode) {
        case 0x31:
          goto switchD_0012f775_caseD_31;
        case 0x32:
          goto switchD_0012f775_caseD_32;
        case 0x33:
          goto switchD_0012f775_caseD_33;
        case 0x34:
          goto switchD_0012f775_caseD_34;
        case 0x35:
          goto switchD_0012f775_caseD_35;
        case 0x36:
          goto switchD_0012f775_caseD_36;
        case 0x37:
          goto switchD_0012f775_caseD_37;
        case 0x38:
          goto switchD_0012f775_caseD_38;
        }
      }
      goto switchD_0012f775_default;
    }
  case 0xffe1:
    goto switchD_0012f06f_caseD_ffe1;
  case 0xffe2:
    goto switchD_0012f06f_caseD_ffe2;
  case 0xffe3:
    goto switchD_0012f06f_caseD_ffe3;
  case 0xffe4:
    goto switchD_0012f06f_caseD_ffe4;
  case 0xffe5:
    goto switchD_0012f06f_caseD_ffe5;
  case 0xffe9:
    goto switchD_0012f06f_caseD_ffe9;
  case 0xffea:
    goto switchD_0012f06f_caseD_ffea;
  case 0xffeb:
    goto switchD_0012f06f_caseD_ffeb;
  case 0xffec:
    goto switchD_0012f06f_caseD_ffec;
  case 0xffff:
    goto switchD_0012f06f_caseD_ffff;
  default:
    switch(keycode) {
    case 0xff50:
      goto switchD_0012f111_caseD_0;
    case 0xff51:
      goto switchD_0012f111_caseD_1;
    case 0xff52:
      goto switchD_0012f111_caseD_2;
    case 0xff53:
      goto switchD_0012f111_caseD_3;
    case 0xff54:
      goto switchD_0012f111_caseD_4;
    case 0xff55:
      goto switchD_0012f111_caseD_5;
    case 0xff56:
      goto switchD_0012f111_caseD_6;
    case 0xff57:
      goto switchD_0012f111_caseD_7;
    case 0xff58:
    case 0xff59:
    case 0xff5a:
    case 0xff5b:
    case 0xff5c:
    case 0xff5d:
    case 0xff5e:
    case 0xff5f:
    case 0xff60:
    case 0xff61:
    case 0xff62:
    case 0xff64:
    case 0xff65:
    case 0xff66:
      goto switchD_0012f06f_caseD_ffac;
    case 0xff63:
      goto switchD_0012f111_caseD_13;
    case 0xff67:
      goto switchD_0012f111_caseD_17;
    default:
      if (keycode != 0xff1b) goto switchD_0012f06f_caseD_ffac;
      this->_is_keyESC = pressed;
      goto switchD_0012f6ac_caseD_1;
    }
  }
  if (0xff07 < (int)keycode) {
    if ((int)keycode < 0xff50) {
      if (keycode != 0xff08) {
        if (keycode != 0xff09) goto switchD_0012f852_caseD_66;
LAB_0012f136:
        this->_is_keyTAB = pressed;
switchD_0012f2d1_default:
        if (0xff0c < (int)keycode) {
          if (0xff66 < (int)keycode) {
            switch(keycode) {
            case 0xffe1:
              goto switchD_0012f06f_caseD_ffe1;
            case 0xffe2:
              goto switchD_0012f06f_caseD_ffe2;
            case 0xffe3:
              goto switchD_0012f06f_caseD_ffe3;
            case 0xffe4:
              goto switchD_0012f06f_caseD_ffe4;
            case 0xffe5:
              goto switchD_0012f06f_caseD_ffe5;
            case 0xffe6:
            case 0xffe7:
            case 0xffe8:
              goto switchD_0012f1e5_caseD_ffe6;
            case 0xffe9:
              goto switchD_0012f06f_caseD_ffe9;
            case 0xffea:
              goto switchD_0012f06f_caseD_ffea;
            case 0xffeb:
              goto switchD_0012f06f_caseD_ffeb;
            case 0xffec:
              goto switchD_0012f06f_caseD_ffec;
            default:
              goto switchD_0012f1e5_default;
            }
          }
          goto LAB_0013000c;
        }
        switch(keycode) {
        case 0x61:
          goto switchD_0012f160_caseD_61;
        case 0x62:
          goto switchD_0012f160_caseD_62;
        case 99:
          goto switchD_0012f160_caseD_63;
        case 100:
          goto switchD_0012f160_caseD_64;
        case 0x65:
          goto switchD_0012f160_caseD_65;
        case 0x66:
          goto switchD_0012f160_caseD_66;
        case 0x67:
          goto switchD_0012f160_caseD_67;
        case 0x68:
          goto switchD_0012f160_caseD_68;
        case 0x69:
          goto switchD_0012f160_caseD_69;
        case 0x6a:
          goto switchD_0012f160_caseD_6a;
        case 0x6b:
          goto switchD_0012f160_caseD_6b;
        case 0x6c:
          goto switchD_0012f160_caseD_6c;
        case 0x6d:
          goto switchD_0012f160_caseD_6d;
        case 0x6e:
          goto switchD_0012f160_caseD_6e;
        case 0x6f:
          goto switchD_0012f160_caseD_6f;
        case 0x70:
          goto switchD_0012f160_caseD_70;
        case 0x71:
          goto switchD_0012f160_caseD_71;
        case 0x72:
          goto switchD_0012f160_caseD_72;
        case 0x73:
          goto switchD_0012f160_caseD_73;
        case 0x74:
          goto switchD_0012f160_caseD_74;
        case 0x75:
          goto switchD_0012f160_caseD_75;
        case 0x76:
          goto switchD_0012f160_caseD_76;
        case 0x77:
          goto switchD_0012f160_caseD_77;
        case 0x78:
          goto switchD_0012f160_caseD_78;
        case 0x79:
          goto switchD_0012f160_caseD_79;
        case 0x7a:
          goto switchD_0012f160_caseD_7a;
        }
        goto switchD_0012f160_default;
      }
LAB_0012faf4:
      this->_is_keyBACKSPACE = pressed;
switchD_0012f801_caseD_31:
      if (0xff0c < (int)keycode) {
        if (0xffe0 < (int)keycode) {
          switch(keycode) {
          case 0xffe1:
            goto switchD_0012f06f_caseD_ffe1;
          case 0xffe2:
            goto switchD_0012f06f_caseD_ffe2;
          case 0xffe3:
            goto switchD_0012f06f_caseD_ffe3;
          case 0xffe4:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
          case 0xffea:
            goto switchD_0012fb3f_caseD_ff51;
          case 0xffe5:
            goto switchD_0012f06f_caseD_ffe5;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffeb;
          default:
            if (keycode != 0xffff) goto switchD_0012fb3f_caseD_ff51;
            goto switchD_0012f06f_caseD_ffff;
          }
        }
        switch(keycode) {
        case 0xff50:
          goto switchD_0012f111_caseD_0;
        case 0xff51:
        case 0xff53:
        case 0xff54:
          goto switchD_0012fb3f_caseD_ff51;
        case 0xff52:
          goto switchD_0012f111_caseD_2;
        case 0xff55:
          goto switchD_0012f111_caseD_5;
        case 0xff56:
          goto switchD_0012f111_caseD_6;
        case 0xff57:
          goto switchD_0012f111_caseD_7;
        default:
          if (keycode != 0xff0d) {
            if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
            goto switchD_0012fb3f_caseD_ff51;
          }
          goto LAB_001307c0;
        }
      }
      switch(keycode) {
      case 0x61:
        goto switchD_0012f160_caseD_61;
      case 0x62:
        goto switchD_0012f160_caseD_62;
      case 99:
        goto switchD_0012f160_caseD_63;
      case 100:
        goto switchD_0012f160_caseD_64;
      case 0x65:
        goto switchD_0012f160_caseD_65;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      case 0x6b:
        goto switchD_0012f160_caseD_6b;
      case 0x6c:
        goto switchD_0012f160_caseD_6c;
      case 0x6d:
        goto switchD_0012f160_caseD_6d;
      case 0x6e:
        goto switchD_0012f160_caseD_6e;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x71:
        goto switchD_0012f160_caseD_71;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x73:
        goto switchD_0012f160_caseD_73;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x76:
        goto switchD_0012f160_caseD_76;
      case 0x77:
        goto switchD_0012f160_caseD_77;
      case 0x78:
        goto switchD_0012f160_caseD_78;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      case 0x7a:
        goto switchD_0012f160_caseD_7a;
      default:
        if (keycode != 0x20) {
          if (keycode == 0xff09) goto LAB_0012f136;
          goto switchD_0012fb3f_caseD_ff51;
        }
      }
      goto switchD_0012f0d2_caseD_20;
    }
    switch(keycode) {
    case 0xff50:
switchD_0012f111_caseD_0:
      this->_is_keyHOME = pressed;
      if ((int)keycode < 0xff09) {
        switch(keycode) {
        case 0x69:
          goto switchD_0012f160_caseD_69;
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x73:
        case 0x76:
        case 0x78:
          break;
        case 0x71:
          goto switchD_0012f160_caseD_71;
        case 0x72:
          goto switchD_0012f160_caseD_72;
        case 0x74:
          goto switchD_0012f160_caseD_74;
        case 0x75:
          goto switchD_0012f160_caseD_75;
        case 0x77:
          goto switchD_0012f160_caseD_77;
        case 0x79:
          goto switchD_0012f160_caseD_79;
        default:
          if (keycode == 0x65) goto switchD_0012f160_caseD_65;
        }
      }
      else {
        if (keycode == 0xff09) goto LAB_0012f136;
        if (keycode == 0xff55) goto switchD_0012f111_caseD_5;
      }
      break;
    case 0xff51:
    case 0xff52:
    case 0xff53:
    case 0xff54:
      goto switchD_0012f852_caseD_66;
    case 0xff55:
switchD_0012f111_caseD_5:
      this->_is_keyPAGEUP = pressed;
      switch(keycode) {
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x73:
      case 0x76:
      case 0x78:
        break;
      case 0x71:
        goto switchD_0012f160_caseD_71;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x77:
        goto switchD_0012f160_caseD_77;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      default:
        if (keycode == 0x65) goto switchD_0012f160_caseD_65;
        if (keycode == 0xff09) goto LAB_0012f136;
      }
      break;
    case 0xff56:
      goto switchD_0012f111_caseD_6;
    case 0xff57:
      goto switchD_0012f111_caseD_7;
    default:
      if (keycode != 0xff63) {
LAB_0012fe43:
        if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
        goto switchD_0012f852_caseD_66;
      }
switchD_0012f111_caseD_13:
      this->_is_keyINSERT = pressed;
switchD_0012f820_caseD_31:
      if ((int)keycode < 0xff0d) {
        switch(keycode) {
        case 0x61:
          goto switchD_0012f160_caseD_61;
        case 0x62:
        case 0x6d:
        case 0x6e:
          break;
        case 99:
          goto switchD_0012f160_caseD_63;
        case 100:
          goto switchD_0012f160_caseD_64;
        case 0x65:
          goto switchD_0012f160_caseD_65;
        case 0x66:
          goto switchD_0012f160_caseD_66;
        case 0x67:
          goto switchD_0012f160_caseD_67;
        case 0x68:
          goto switchD_0012f160_caseD_68;
        case 0x69:
          goto switchD_0012f160_caseD_69;
        case 0x6a:
          goto switchD_0012f160_caseD_6a;
        case 0x6b:
          goto switchD_0012f160_caseD_6b;
        case 0x6c:
          goto switchD_0012f160_caseD_6c;
        case 0x6f:
          goto switchD_0012f160_caseD_6f;
        case 0x70:
          goto switchD_0012f160_caseD_70;
        case 0x71:
          goto switchD_0012f160_caseD_71;
        case 0x72:
          goto switchD_0012f160_caseD_72;
        case 0x73:
          goto switchD_0012f160_caseD_73;
        case 0x74:
          goto switchD_0012f160_caseD_74;
        case 0x75:
          goto switchD_0012f160_caseD_75;
        case 0x76:
          goto switchD_0012f160_caseD_76;
        case 0x77:
          goto switchD_0012f160_caseD_77;
        case 0x78:
          goto switchD_0012f160_caseD_78;
        case 0x79:
          goto switchD_0012f160_caseD_79;
        case 0x7a:
          goto switchD_0012f160_caseD_7a;
        default:
          if (keycode == 0xff09) goto LAB_0012f136;
        }
      }
      else if ((int)keycode < 0xffe1) {
        switch(keycode) {
        case 0xff50:
          goto switchD_0012f111_caseD_0;
        case 0xff51:
        case 0xff52:
        case 0xff53:
        case 0xff54:
          break;
        case 0xff55:
          goto switchD_0012f111_caseD_5;
        case 0xff56:
          goto switchD_0012f111_caseD_6;
        case 0xff57:
          goto switchD_0012f111_caseD_7;
        default:
          if (keycode == 0xff0d) goto LAB_001307c0;
        }
      }
      else {
        if (keycode == 0xffe1) goto switchD_0012f06f_caseD_ffe1;
        if (keycode == 0xffe5) goto switchD_0012f06f_caseD_ffe5;
        if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
      }
      goto switchD_0012fc29_caseD_62;
    }
switchD_0012fcbb_caseD_6a:
    if (0xff0c < (int)keycode) {
      if (0xff56 < (int)keycode) {
        switch(keycode) {
        case 0xffe1:
          goto switchD_0012f06f_caseD_ffe1;
        case 0xffe2:
          goto switchD_0012f06f_caseD_ffe2;
        case 0xffe3:
          goto switchD_0012f06f_caseD_ffe3;
        case 0xffe4:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto switchD_0012ff2f_caseD_65;
        case 0xffe5:
          goto switchD_0012f06f_caseD_ffe5;
        case 0xffe9:
          goto switchD_0012f06f_caseD_ffe9;
        case 0xffea:
          goto switchD_0012f06f_caseD_ffea;
        case 0xffeb:
          goto switchD_0012f06f_caseD_ffeb;
        case 0xffec:
          goto switchD_0012f06f_caseD_ffec;
        default:
          if (keycode == 0xff57) goto switchD_0012f111_caseD_7;
          if (keycode != 0xffff) goto switchD_0012ff2f_caseD_65;
          goto switchD_0012f06f_caseD_ffff;
        }
      }
      if (keycode == 0xff0d) goto LAB_001307c0;
      if (keycode != 0xff52) {
        if (keycode != 0xff56) goto switchD_0012ff2f_caseD_65;
        goto switchD_0012f111_caseD_6;
      }
      goto switchD_0012f111_caseD_2;
    }
    switch(keycode) {
    case 0x61:
      goto switchD_0012f160_caseD_61;
    case 0x62:
      goto switchD_0012f160_caseD_62;
    case 99:
      goto switchD_0012f160_caseD_63;
    case 100:
      goto switchD_0012f160_caseD_64;
    case 0x65:
    case 0x69:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x79:
      goto switchD_0012ff2f_caseD_65;
    case 0x66:
      goto switchD_0012f160_caseD_66;
    case 0x67:
      goto switchD_0012f160_caseD_67;
    case 0x68:
      goto switchD_0012f160_caseD_68;
    case 0x6a:
      goto switchD_0012f160_caseD_6a;
    case 0x6b:
      goto switchD_0012f160_caseD_6b;
    case 0x6c:
      goto switchD_0012f160_caseD_6c;
    case 0x6d:
      goto switchD_0012f160_caseD_6d;
    case 0x6e:
      goto switchD_0012f160_caseD_6e;
    case 0x6f:
switchD_0012f160_caseD_6f:
      this->_is_keyO = pressed;
      if (0xff56 < (int)keycode) {
        if (keycode != 0xff57) {
switchD_0012f212_default:
          if (keycode == 0xffe5) goto switchD_0012f06f_caseD_ffe5;
          if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
          goto switchD_0012f570_caseD_62;
        }
        goto switchD_0012f111_caseD_7;
      }
      if (keycode == 0x61) goto switchD_0012f160_caseD_61;
      if (keycode == 0x70) goto switchD_0012f160_caseD_70;
      if (keycode == 0xff56) goto switchD_0012f111_caseD_6;
      goto switchD_0012f570_caseD_62;
    case 0x70:
      goto switchD_0012f160_caseD_70;
    case 0x73:
      goto switchD_0012f160_caseD_73;
    case 0x76:
      goto switchD_0012f160_caseD_76;
    case 0x78:
      goto switchD_0012f160_caseD_78;
    case 0x7a:
      goto switchD_0012f160_caseD_7a;
    default:
      if (keycode != 0x20) goto switchD_0012ff2f_caseD_65;
      goto switchD_0012f0d2_caseD_20;
    }
  }
  if (100 < (int)keycode) {
    switch(keycode) {
    case 0x65:
switchD_0012f160_caseD_65:
      this->_is_keyE = pressed;
      switch(keycode) {
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
      case 0x78:
        goto switchD_0012fd79_caseD_6a;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      default:
switchD_0012fd79_default:
        if (keycode != 0xffff) goto switchD_0012fd79_caseD_6a;
        goto switchD_0012f06f_caseD_ffff;
      }
    default:
      goto switchD_0012f852_caseD_66;
    case 0x69:
switchD_0012f160_caseD_69:
      this->_is_keyI = pressed;
      goto switchD_0012fcbb_caseD_6a;
    case 0x6f:
      goto switchD_0012f160_caseD_6f;
    case 0x70:
      goto switchD_0012f160_caseD_70;
    case 0x71:
switchD_0012f160_caseD_71:
      this->_is_keyQ = pressed;
      switch(keycode) {
      case 0x65:
        goto switchD_0012f160_caseD_65;
      default:
        goto switchD_0012fcfd_caseD_6a;
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x77:
        goto switchD_0012f160_caseD_77;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      }
    case 0x72:
switchD_0012f160_caseD_72:
      this->_is_keyR = pressed;
      switch(keycode) {
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x76:
      case 0x77:
      case 0x78:
        goto switchD_0012fd79_caseD_6a;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      default:
        if (keycode != 0x69) goto switchD_0012fd79_default;
        goto switchD_0012f160_caseD_69;
      }
    case 0x74:
switchD_0012f160_caseD_74:
      this->_is_keyT = pressed;
      if ((int)keycode < 0x75) {
        if (keycode == 0x69) goto switchD_0012f160_caseD_69;
        if (keycode == 0x6f) goto switchD_0012f160_caseD_6f;
        if (keycode != 0x70) goto LAB_001301a7;
        goto switchD_0012f160_caseD_70;
      }
      if ((int)keycode < 0xff57) {
        if (keycode == 0x75) goto switchD_0012f160_caseD_75;
        if (keycode == 0x79) goto switchD_0012f160_caseD_79;
      }
      else {
        if (keycode == 0xff57) goto switchD_0012f111_caseD_7;
        if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
      }
      goto LAB_001301a7;
    case 0x75:
      goto switchD_0012f160_caseD_75;
    case 0x77:
switchD_0012f160_caseD_77:
      this->_is_keyW = pressed;
      switch(keycode) {
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
      case 0x78:
        break;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      default:
        if (keycode == 0x65) goto switchD_0012f160_caseD_65;
      }
      goto switchD_0012fcfd_caseD_6a;
    case 0x79:
switchD_0012f160_caseD_79:
      this->_is_keyY = pressed;
switchD_0012f59f_caseD_73:
      if (0xff50 < (int)keycode) {
        if ((int)keycode < 0xffb2) {
          if ((int)keycode < 0xff67) {
            switch(keycode) {
            case 0xff51:
              goto switchD_0012f111_caseD_1;
            case 0xff52:
              goto switchD_0012f111_caseD_2;
            case 0xff53:
              goto switchD_0012f111_caseD_3;
            case 0xff54:
              goto switchD_0012f111_caseD_4;
            default:
              goto code_r0x00130ffe;
            case 0xff56:
              goto switchD_0012f111_caseD_6;
            case 0xff57:
              goto switchD_0012f111_caseD_7;
            }
          }
          if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
          if (keycode == 0xffb0) goto switchD_0012f06f_caseD_ffb0;
          if (keycode != 0xffb1) goto code_r0x00130ffe;
          goto switchD_0012f06f_caseD_ffb1;
        }
        switch(keycode) {
        case 0xffe1:
          goto switchD_0012f06f_caseD_ffe1;
        case 0xffe2:
          goto switchD_0012f06f_caseD_ffe2;
        case 0xffe3:
          goto switchD_0012f06f_caseD_ffe3;
        case 0xffe4:
          goto switchD_0012f06f_caseD_ffe4;
        case 0xffe5:
          goto switchD_0012f06f_caseD_ffe5;
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto code_r0x00130ffe;
        case 0xffe9:
          goto switchD_0012f06f_caseD_ffe9;
        case 0xffea:
          goto switchD_0012f06f_caseD_ffea;
        case 0xffeb:
          goto switchD_0012f06f_caseD_ffeb;
        case 0xffec:
          goto switchD_0012f06f_caseD_ffec;
        default:
          if (keycode != 0xffb2) {
            if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
            goto code_r0x00130ffe;
          }
        }
        goto switchD_0012f06f_caseD_ffb2;
      }
      switch(keycode) {
      case 0x61:
        goto switchD_0012f160_caseD_61;
      case 0x62:
        goto switchD_0012f160_caseD_62;
      case 99:
        goto switchD_0012f160_caseD_63;
      case 100:
        goto switchD_0012f160_caseD_64;
      case 0x65:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x77:
      case 0x79:
        break;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      case 0x6b:
        goto switchD_0012f160_caseD_6b;
      case 0x6c:
        goto switchD_0012f160_caseD_6c;
      case 0x6d:
        goto switchD_0012f160_caseD_6d;
      case 0x6e:
        goto switchD_0012f160_caseD_6e;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x73:
        goto switchD_0012f160_caseD_73;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x76:
        goto switchD_0012f160_caseD_76;
      case 0x78:
        goto switchD_0012f160_caseD_78;
      case 0x7a:
        goto switchD_0012f160_caseD_7a;
      default:
        if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
        if (keycode == 0xff0d) goto LAB_001307c0;
      }
      goto code_r0x00130ffe;
    }
  }
  if (keycode == 0x30) {
switchD_0012f0d2_caseD_30:
    this->_is_key0 = pressed;
switchD_0012f7de_caseD_31:
    if ((int)keycode < 0xff09) {
      switch(keycode) {
      case 0x61:
        goto switchD_0012f160_caseD_61;
      case 0x62:
      case 99:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x76:
      case 0x78:
        break;
      case 100:
        goto switchD_0012f160_caseD_64;
      case 0x65:
        goto switchD_0012f160_caseD_65;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x71:
        goto switchD_0012f160_caseD_71;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x73:
        goto switchD_0012f160_caseD_73;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x77:
        goto switchD_0012f160_caseD_77;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      default:
        if (keycode == 0xff08) goto LAB_0012faf4;
      }
    }
    else if ((int)keycode < 0xff63) {
      switch(keycode) {
      case 0xff50:
        goto switchD_0012f111_caseD_0;
      case 0xff51:
      case 0xff52:
      case 0xff53:
      case 0xff54:
        break;
      case 0xff55:
        goto switchD_0012f111_caseD_5;
      case 0xff56:
        goto switchD_0012f111_caseD_6;
      case 0xff57:
        goto switchD_0012f111_caseD_7;
      default:
        if (keycode == 0xff09) goto LAB_0012f136;
      }
    }
    else {
      if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
      if (keycode == 0xffe5) goto switchD_0012f06f_caseD_ffe5;
      if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
    }
    goto switchD_0012fa82_caseD_62;
  }
  if (keycode == 0x38) {
switchD_0012f775_caseD_38:
    this->_is_key8 = pressed;
switchD_0012f775_default:
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x61:
        goto switchD_0012f160_caseD_61;
      case 0x62:
      case 99:
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x76:
      case 0x78:
        break;
      case 100:
        goto switchD_0012f160_caseD_64;
      case 0x65:
        goto switchD_0012f160_caseD_65;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x69:
        goto switchD_0012f160_caseD_69;
      case 0x6f:
        goto switchD_0012f160_caseD_6f;
      case 0x70:
        goto switchD_0012f160_caseD_70;
      case 0x71:
        goto switchD_0012f160_caseD_71;
      case 0x72:
        goto switchD_0012f160_caseD_72;
      case 0x73:
        goto switchD_0012f160_caseD_73;
      case 0x74:
        goto switchD_0012f160_caseD_74;
      case 0x75:
        goto switchD_0012f160_caseD_75;
      case 0x77:
        goto switchD_0012f160_caseD_77;
      case 0x79:
        goto switchD_0012f160_caseD_79;
      default:
        if (keycode == 0x30) goto switchD_0012f0d2_caseD_30;
        if (keycode == 0x39) goto switchD_0012f0d2_caseD_39;
      }
    }
    else if ((int)keycode < 0xff63) {
      switch(keycode) {
      case 0xff50:
        goto switchD_0012f111_caseD_0;
      case 0xff51:
      case 0xff52:
      case 0xff53:
      case 0xff54:
        break;
      case 0xff55:
        goto switchD_0012f111_caseD_5;
      case 0xff56:
        goto switchD_0012f111_caseD_6;
      case 0xff57:
        goto switchD_0012f111_caseD_7;
      default:
        if (keycode == 0xff08) goto LAB_0012faf4;
        if (keycode == 0xff09) goto LAB_0012f136;
      }
    }
    else {
      if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
      if (keycode == 0xffe5) goto switchD_0012f06f_caseD_ffe5;
      if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
    }
    goto switchD_0012f8e9_caseD_62;
  }
  if (keycode != 0x39) goto switchD_0012f852_caseD_66;
switchD_0012f0d2_caseD_39:
  this->_is_key9 = pressed;
switchD_0012f798_default:
  if ((int)keycode < 0xff08) {
    if (keycode - 0x61 < 0x19) {
      pCVar1 = (CImgDisplay *)
               (*(code *)(&DAT_0016f210 + *(int *)(&DAT_0016f210 + (ulong)(keycode - 0x61) * 4)))();
      return pCVar1;
    }
    if (keycode == 0x30) goto switchD_0012f0d2_caseD_30;
  }
  else if ((int)keycode < 0xff63) {
    if (keycode - 0xff50 < 8) {
      pCVar1 = (CImgDisplay *)
               (*(code *)(&DAT_0016f274 + *(int *)(&DAT_0016f274 + (ulong)(keycode - 0xff50) * 4)))
                         ();
      return pCVar1;
    }
    if (keycode == 0xff08) goto LAB_0012faf4;
    if (keycode == 0xff09) goto LAB_0012f136;
  }
  else {
    if (keycode == 0xff63) goto switchD_0012f111_caseD_13;
    if (keycode == 0xffe5) goto switchD_0012f06f_caseD_ffe5;
    if (keycode == 0xffff) goto switchD_0012f06f_caseD_ffff;
  }
LAB_001303e5:
  if ((int)keycode < 0xff67) {
    if ((int)keycode < 0xff0d) {
      if (keycode - 0x62 < 0x19) {
        pCVar1 = (CImgDisplay *)
                 (*(code *)(&DAT_0016fc80 + *(int *)(&DAT_0016fc80 + (ulong)(keycode - 0x62) * 4)))
                           ();
        return pCVar1;
      }
switchD_0013048f_default:
      if (keycode != 0x20) goto switchD_0012f06f_caseD_ffac;
switchD_0012f0d2_caseD_20:
      this->_is_keySPACE = pressed;
switchD_0012fb3f_caseD_ff51:
      if (0xffa9 < (int)keycode) {
        if ((int)keycode < 0xffe4) {
          switch(keycode) {
          case 0xffaa:
            goto switchD_0012f06f_caseD_ffaa;
          case 0xffab:
            goto switchD_0012f06f_caseD_ffab;
          default:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffad:
            goto switchD_0012f06f_caseD_ffad;
          case 0xffaf:
            goto switchD_0012f06f_caseD_ffaf;
          case 0xffb0:
            goto switchD_0012f06f_caseD_ffb0;
          case 0xffb1:
            goto switchD_0012f06f_caseD_ffb1;
          case 0xffb2:
            goto switchD_0012f06f_caseD_ffb2;
          case 0xffb3:
            goto switchD_0012f06f_caseD_ffb3;
          case 0xffb4:
            goto switchD_0012f06f_caseD_ffb4;
          case 0xffb5:
            goto switchD_0012f06f_caseD_ffb5;
          case 0xffb6:
            goto switchD_0012f06f_caseD_ffb6;
          case 0xffb7:
            goto switchD_0012f06f_caseD_ffb7;
          case 0xffb8:
            goto switchD_0012f06f_caseD_ffb8;
          case 0xffb9:
            goto switchD_0012f06f_caseD_ffb9;
          }
        }
        if (keycode != 0xffe4) {
          if (keycode != 0xffec) {
            if (keycode != 0xffea) goto switchD_0012f06f_caseD_ffac;
            goto switchD_0012f06f_caseD_ffea;
          }
          goto switchD_0012f06f_caseD_ffec;
        }
        goto switchD_0012f06f_caseD_ffe4;
      }
LAB_00130df3:
      if ((int)keycode < 0xff54) {
        if (keycode == 0xff51) goto switchD_0012f111_caseD_1;
        if (keycode != 0xff53) goto switchD_0012f06f_caseD_ffac;
        goto switchD_0012f111_caseD_3;
      }
      if (keycode == 0xff54) goto switchD_0012f111_caseD_4;
      goto switchD_00130cb0_default;
    }
    if (keycode - 0xff51 < 4) {
      pCVar1 = (CImgDisplay *)
               (*(code *)(&DAT_0016fce4 + *(int *)(&DAT_0016fce4 + (ulong)(keycode - 0xff51) * 4)))
                         ();
      return pCVar1;
    }
switchD_001307b1_default:
    if (keycode != 0xff0d) goto switchD_0012f06f_caseD_ffac;
LAB_001307c0:
    this->_is_keyENTER = pressed;
switchD_00130384_caseD_69:
    if (0xff66 < (int)keycode) {
      switch(keycode) {
      case 0xffaa:
        goto switchD_0012f06f_caseD_ffaa;
      case 0xffab:
        goto switchD_0012f06f_caseD_ffab;
      case 0xffac:
      case 0xffae:
        goto switchD_0012f06f_caseD_ffac;
      case 0xffad:
        goto switchD_0012f06f_caseD_ffad;
      case 0xffaf:
        goto switchD_0012f06f_caseD_ffaf;
      case 0xffb0:
        goto switchD_0012f06f_caseD_ffb0;
      case 0xffb1:
        goto switchD_0012f06f_caseD_ffb1;
      case 0xffb2:
        goto switchD_0012f06f_caseD_ffb2;
      case 0xffb3:
        goto switchD_0012f06f_caseD_ffb3;
      case 0xffb4:
        goto switchD_0012f06f_caseD_ffb4;
      case 0xffb5:
        goto switchD_0012f06f_caseD_ffb5;
      case 0xffb6:
        goto switchD_0012f06f_caseD_ffb6;
      case 0xffb7:
        goto switchD_0012f06f_caseD_ffb7;
      case 0xffb8:
        goto switchD_0012f06f_caseD_ffb8;
      case 0xffb9:
        goto switchD_0012f06f_caseD_ffb9;
      }
      switch(keycode) {
      case 0xffe1:
switchD_0012f06f_caseD_ffe1:
        this->_is_keySHIFTLEFT = pressed;
        if ((int)keycode < 0x76) {
          if (keycode == 0x62) goto switchD_0012f160_caseD_62;
          if (keycode == 99) goto switchD_0012f160_caseD_63;
          if (keycode == 0x6e) goto switchD_0012f160_caseD_6e;
        }
        else {
          if (keycode == 0x76) goto switchD_0012f160_caseD_76;
          if (keycode == 0x78) goto switchD_0012f160_caseD_78;
          if (keycode == 0x7a) goto switchD_0012f160_caseD_7a;
        }
LAB_00130a81:
        if ((int)keycode < 0xff67) {
          switch(keycode) {
          case 0xff51:
            goto switchD_0012f111_caseD_1;
          case 0xff52:
            goto switchD_0012f111_caseD_2;
          case 0xff53:
            goto switchD_0012f111_caseD_3;
          case 0xff54:
            goto switchD_0012f111_caseD_4;
          default:
            if (keycode != 0x20) goto LAB_00130ab4;
            goto switchD_0012f0d2_caseD_20;
          }
        }
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe2:
            goto switchD_0012f06f_caseD_ffe2;
          case 0xffe3:
            goto switchD_0012f06f_caseD_ffe3;
          case 0xffe4:
            goto switchD_0012f06f_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffea:
            goto switchD_0012f06f_caseD_ffea;
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffeb;
          case 0xffec:
            goto switchD_0012f06f_caseD_ffec;
          default:
            goto switchD_00130cb0_default;
          }
        }
      case 0xffe2:
switchD_0012f06f_caseD_ffe2:
        this->_is_keySHIFTRIGHT = pressed;
        if ((int)keycode < 0xffe3) {
          if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
          if (keycode == 0xff52) goto switchD_0012f111_caseD_2;
        }
        else {
          if (keycode == 0xffe3) goto switchD_0012f06f_caseD_ffe3;
          if (keycode == 0xffe9) goto switchD_0012f06f_caseD_ffe9;
          if (keycode == 0xffeb) goto switchD_0012f06f_caseD_ffeb;
        }
        goto switchD_0012fb3f_caseD_ff51;
      case 0xffe3:
switchD_0012f06f_caseD_ffe3:
        this->_is_keyCTRLLEFT = pressed;
        goto LAB_00130bea;
      case 0xffe5:
      case 0xffe6:
      case 0xffe7:
      case 0xffe8:
        goto switchD_0012f06f_caseD_ffac;
      case 0xffe9:
switchD_0012f06f_caseD_ffe9:
        this->_is_keyALT = pressed;
        if (0xffe3 < (int)keycode) {
          if (keycode != 0xffe4) {
            if (keycode == 0xffea) goto switchD_0012f06f_caseD_ffea;
            if (keycode != 0xffec) goto switchD_0012f1e5_caseD_ffe6;
            goto switchD_0012f06f_caseD_ffec;
          }
          goto switchD_0012f06f_caseD_ffe4;
        }
        if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
        if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
        goto switchD_0012f1e5_caseD_ffe6;
      case 0xffea:
switchD_0012f06f_caseD_ffea:
        this->_is_keyALTGR = pressed;
switchD_00130be2_caseD_ffe4:
        if ((int)keycode < 0xffaa) goto LAB_00130df3;
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          if (keycode != 0xffe4) {
            if (keycode != 0xffec) goto switchD_0012f06f_caseD_ffac;
            goto switchD_0012f06f_caseD_ffec;
          }
        }
      case 0xffe4:
switchD_0012f06f_caseD_ffe4:
        this->_is_keyCTRLRIGHT = pressed;
switchD_0012f1e5_caseD_ffe6:
        if (0xffa9 < (int)keycode) {
          switch(keycode) {
          case 0xffaa:
            goto switchD_0012f06f_caseD_ffaa;
          case 0xffab:
            goto switchD_0012f06f_caseD_ffab;
          default:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffad:
            goto switchD_0012f06f_caseD_ffad;
          case 0xffaf:
            goto switchD_0012f06f_caseD_ffaf;
          case 0xffb0:
            goto switchD_0012f06f_caseD_ffb0;
          case 0xffb1:
            goto switchD_0012f06f_caseD_ffb1;
          case 0xffb2:
            goto switchD_0012f06f_caseD_ffb2;
          case 0xffb3:
            goto switchD_0012f06f_caseD_ffb3;
          case 0xffb4:
            goto switchD_0012f06f_caseD_ffb4;
          case 0xffb5:
            goto switchD_0012f06f_caseD_ffb5;
          case 0xffb6:
            goto switchD_0012f06f_caseD_ffb6;
          case 0xffb7:
            goto switchD_0012f06f_caseD_ffb7;
          case 0xffb8:
            goto switchD_0012f06f_caseD_ffb8;
          case 0xffb9:
            goto switchD_0012f06f_caseD_ffb9;
          }
        }
        goto LAB_00130eed;
      case 0xffeb:
switchD_0012f06f_caseD_ffeb:
        this->_is_keyAPPLEFT = pressed;
switchD_0012f6ac_caseD_1:
        if ((int)keycode < 0xff67) goto LAB_00130c5a;
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe4:
            goto switchD_0012f06f_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffea:
            goto switchD_0012f06f_caseD_ffea;
          case 0xffec:
            goto switchD_0012f06f_caseD_ffec;
          default:
            goto switchD_00130cb0_default;
          }
        }
      case 0xffec:
        goto switchD_0012f06f_caseD_ffec;
      default:
        goto switchD_00130cb0_default;
      }
    }
    if (0x77 < (int)keycode) {
      switch(keycode) {
      case 0xff51:
        goto switchD_0012f111_caseD_1;
      case 0xff52:
switchD_0012f111_caseD_2:
        this->_is_keyARROWUP = pressed;
        switch(keycode) {
        case 0xffe3:
          goto switchD_0012f06f_caseD_ffe3;
        case 0xffe4:
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          break;
        case 0xffe9:
          goto switchD_0012f06f_caseD_ffe9;
        case 0xffea:
          goto switchD_0012f06f_caseD_ffea;
        case 0xffeb:
          goto switchD_0012f06f_caseD_ffeb;
        default:
          if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
        }
        goto switchD_00130be2_caseD_ffe4;
      case 0xff53:
        goto switchD_0012f111_caseD_3;
      case 0xff54:
        goto switchD_0012f111_caseD_4;
      default:
        if (keycode == 0x78) {
switchD_0012f160_caseD_78:
          this->_is_keyX = pressed;
          if ((int)keycode < 0x6d) {
            if (keycode == 0x62) goto switchD_0012f160_caseD_62;
            if (keycode == 99) goto switchD_0012f160_caseD_63;
          }
          else {
            if (keycode == 0x6d) goto switchD_0012f160_caseD_6d;
            if (keycode == 0x6e) goto switchD_0012f160_caseD_6e;
            if (keycode == 0x76) goto switchD_0012f160_caseD_76;
          }
        }
        else {
          if (keycode != 0x7a) goto switchD_0012f06f_caseD_ffac;
switchD_0012f160_caseD_7a:
          this->_is_keyZ = pressed;
          if ((int)keycode < 0x6e) {
            if (keycode == 0x62) goto switchD_0012f160_caseD_62;
            if (keycode == 99) goto switchD_0012f160_caseD_63;
            if (keycode == 0x6d) goto switchD_0012f160_caseD_6d;
          }
          else {
            if (keycode == 0x6e) {
switchD_0012f160_caseD_6e:
              this->_is_keyN = pressed;
              goto LAB_00130a81;
            }
            if (keycode == 0x76) goto switchD_0012f160_caseD_76;
            if (keycode == 0x78) goto switchD_0012f160_caseD_78;
          }
        }
LAB_00130ac4:
        if (0xffa9 < (int)keycode) {
          switch(keycode) {
          case 0xffaa:
            goto switchD_0012f06f_caseD_ffaa;
          case 0xffab:
            goto switchD_0012f06f_caseD_ffab;
          case 0xffac:
          case 0xffae:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffad:
            goto switchD_0012f06f_caseD_ffad;
          case 0xffaf:
            goto switchD_0012f06f_caseD_ffaf;
          case 0xffb0:
            goto switchD_0012f06f_caseD_ffb0;
          case 0xffb1:
            goto switchD_0012f06f_caseD_ffb1;
          case 0xffb2:
            goto switchD_0012f06f_caseD_ffb2;
          case 0xffb3:
            goto switchD_0012f06f_caseD_ffb3;
          case 0xffb4:
            goto switchD_0012f06f_caseD_ffb4;
          case 0xffb5:
            goto switchD_0012f06f_caseD_ffb5;
          case 0xffb6:
            goto switchD_0012f06f_caseD_ffb6;
          case 0xffb7:
            goto switchD_0012f06f_caseD_ffb7;
          case 0xffb8:
            goto switchD_0012f06f_caseD_ffb8;
          case 0xffb9:
            goto switchD_0012f06f_caseD_ffb9;
          default:
            switch(keycode) {
            case 0xffe2:
              goto switchD_0012f06f_caseD_ffe2;
            case 0xffe3:
              goto switchD_0012f06f_caseD_ffe3;
            case 0xffe4:
              goto switchD_0012f06f_caseD_ffe4;
            default:
              goto switchD_0012f06f_caseD_ffac;
            case 0xffe9:
              goto switchD_0012f06f_caseD_ffe9;
            case 0xffea:
              goto switchD_0012f06f_caseD_ffea;
            case 0xffeb:
              goto switchD_0012f06f_caseD_ffeb;
            case 0xffec:
              goto switchD_0012f06f_caseD_ffec;
            }
          }
        }
        switch(keycode) {
        case 0xff51:
          goto switchD_0012f111_caseD_1;
        case 0xff52:
          goto switchD_0012f111_caseD_2;
        case 0xff53:
          goto switchD_0012f111_caseD_3;
        case 0xff54:
          goto switchD_0012f111_caseD_4;
        default:
          if (keycode != 0x20) goto switchD_00130cb0_default;
          goto switchD_0012f0d2_caseD_20;
        }
      }
    }
    if (0x6c < (int)keycode) {
      if (keycode != 0x6d) {
switchD_00130950_default:
        if (keycode != 0x6e) {
          if (keycode != 0x76) goto switchD_0012f06f_caseD_ffac;
switchD_0012f160_caseD_76:
          this->_is_keyV = pressed;
switchD_0012fc29_caseD_62:
          if (0xff66 < (int)keycode) {
            switch(keycode) {
            case 0xffaa:
              goto switchD_0012f06f_caseD_ffaa;
            case 0xffab:
              goto switchD_0012f06f_caseD_ffab;
            case 0xffac:
            case 0xffae:
              goto switchD_0012f06f_caseD_ffac;
            case 0xffad:
              goto switchD_0012f06f_caseD_ffad;
            case 0xffaf:
              goto switchD_0012f06f_caseD_ffaf;
            case 0xffb0:
              goto switchD_0012f06f_caseD_ffb0;
            case 0xffb1:
              goto switchD_0012f06f_caseD_ffb1;
            case 0xffb2:
              goto switchD_0012f06f_caseD_ffb2;
            case 0xffb3:
              goto switchD_0012f06f_caseD_ffb3;
            case 0xffb4:
              goto switchD_0012f06f_caseD_ffb4;
            case 0xffb5:
              goto switchD_0012f06f_caseD_ffb5;
            case 0xffb6:
              goto switchD_0012f06f_caseD_ffb6;
            case 0xffb7:
              goto switchD_0012f06f_caseD_ffb7;
            case 0xffb8:
              goto switchD_0012f06f_caseD_ffb8;
            case 0xffb9:
              goto switchD_0012f06f_caseD_ffb9;
            default:
              switch(keycode) {
              case 0xffe2:
                goto switchD_0012f06f_caseD_ffe2;
              case 0xffe3:
                goto switchD_0012f06f_caseD_ffe3;
              case 0xffe4:
                goto switchD_0012f06f_caseD_ffe4;
              case 0xffe5:
              case 0xffe6:
              case 0xffe7:
              case 0xffe8:
                goto switchD_0012f06f_caseD_ffac;
              case 0xffe9:
                goto switchD_0012f06f_caseD_ffe9;
              case 0xffea:
                goto switchD_0012f06f_caseD_ffea;
              case 0xffeb:
                goto switchD_0012f06f_caseD_ffeb;
              case 0xffec:
                goto switchD_0012f06f_caseD_ffec;
              default:
                goto switchD_00130cb0_default;
              }
            }
          }
          if ((int)keycode < 0x6e) goto LAB_001309d1;
          switch(keycode) {
          case 0xff51:
            goto switchD_0012f111_caseD_1;
          case 0xff52:
            goto switchD_0012f111_caseD_2;
          case 0xff53:
            goto switchD_0012f111_caseD_3;
          case 0xff54:
            goto switchD_0012f111_caseD_4;
          default:
switchD_00130a6f_default:
            if (keycode != 0x6e) goto switchD_0012f06f_caseD_ffac;
          }
        }
        goto switchD_0012f160_caseD_6e;
      }
switchD_0012f160_caseD_6d:
      this->_is_keyM = pressed;
      goto LAB_00130ac4;
    }
LAB_001307f7:
    if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
    if (keycode != 0x62) {
      if (keycode != 99) goto switchD_0012f06f_caseD_ffac;
switchD_0012f160_caseD_63:
      this->_is_keyC = pressed;
LAB_00130907:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe2:
            goto switchD_0012f06f_caseD_ffe2;
          case 0xffe3:
            goto switchD_0012f06f_caseD_ffe3;
          case 0xffe4:
            goto switchD_0012f06f_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffea:
            goto switchD_0012f06f_caseD_ffea;
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffeb;
          case 0xffec:
            goto switchD_0012f06f_caseD_ffec;
          default:
            goto switchD_00130cb0_default;
          }
        }
      }
      if (0x6d < (int)keycode) {
        switch(keycode) {
        case 0xff51:
          goto switchD_0012f111_caseD_1;
        case 0xff52:
          goto switchD_0012f111_caseD_2;
        case 0xff53:
          goto switchD_0012f111_caseD_3;
        case 0xff54:
          goto switchD_0012f111_caseD_4;
        }
        goto switchD_00130950_default;
      }
LAB_001309d1:
      if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
      if (keycode == 0x62) goto switchD_0012f160_caseD_62;
LAB_00130ab4:
      if (keycode != 0x6d) goto switchD_0012f06f_caseD_ffac;
      goto switchD_0012f160_caseD_6d;
    }
switchD_0012f160_caseD_62:
    this->_is_keyB = pressed;
    if ((int)keycode < 0xff52) {
      if (keycode == 0x6d) goto switchD_0012f160_caseD_6d;
      if (keycode == 0x6e) goto switchD_0012f160_caseD_6e;
    }
    else {
      if (keycode == 0xff52) goto switchD_0012f111_caseD_2;
      if (keycode == 0xffe2) goto switchD_0012f06f_caseD_ffe2;
      if (keycode == 0xffe3) goto switchD_0012f06f_caseD_ffe3;
    }
LAB_00130bea:
    if (0xff66 < (int)keycode) {
      switch(keycode) {
      case 0xffaa:
        goto switchD_0012f06f_caseD_ffaa;
      case 0xffab:
        goto switchD_0012f06f_caseD_ffab;
      case 0xffac:
      case 0xffae:
        goto switchD_0012f06f_caseD_ffac;
      case 0xffad:
        goto switchD_0012f06f_caseD_ffad;
      case 0xffaf:
        goto switchD_0012f06f_caseD_ffaf;
      case 0xffb0:
        goto switchD_0012f06f_caseD_ffb0;
      case 0xffb1:
        goto switchD_0012f06f_caseD_ffb1;
      case 0xffb2:
        goto switchD_0012f06f_caseD_ffb2;
      case 0xffb3:
        goto switchD_0012f06f_caseD_ffb3;
      case 0xffb4:
        goto switchD_0012f06f_caseD_ffb4;
      case 0xffb5:
        goto switchD_0012f06f_caseD_ffb5;
      case 0xffb6:
        goto switchD_0012f06f_caseD_ffb6;
      case 0xffb7:
        goto switchD_0012f06f_caseD_ffb7;
      case 0xffb8:
        goto switchD_0012f06f_caseD_ffb8;
      case 0xffb9:
        goto switchD_0012f06f_caseD_ffb9;
      default:
        switch(keycode) {
        case 0xffe4:
          goto switchD_0012f06f_caseD_ffe4;
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffe9:
          goto switchD_0012f06f_caseD_ffe9;
        case 0xffea:
          goto switchD_0012f06f_caseD_ffea;
        case 0xffeb:
          goto switchD_0012f06f_caseD_ffeb;
        case 0xffec:
          goto switchD_0012f06f_caseD_ffec;
        default:
          goto switchD_00130cb0_default;
        }
      }
    }
LAB_00130c5a:
    if ((int)keycode < 0xff53) {
      if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
      if (keycode != 0xff51) goto switchD_0012f06f_caseD_ffac;
      goto switchD_0012f111_caseD_1;
    }
    goto switchD_00130f2f_default;
  }
  if (keycode - 0xffaa < 0x10) {
    pCVar1 = (CImgDisplay *)
             (*(code *)(&DAT_0016fcf4 + *(int *)(&DAT_0016fcf4 + (ulong)(keycode - 0xffaa) * 4)))();
    return pCVar1;
  }
  if (keycode - 0xffe1 < 0xc) {
    pCVar1 = (CImgDisplay *)
             (*(code *)(&DAT_0016fd34 + *(int *)(&DAT_0016fd34 + (ulong)(keycode - 0xffe1) * 4)))();
    return pCVar1;
  }
switchD_00130cb0_default:
  if (keycode != 0xff67) goto switchD_0012f06f_caseD_ffac;
switchD_0012f111_caseD_17:
  this->_is_keyMENU = pressed;
  if ((int)keycode < 0xff54) {
    if (keycode != 0xff51) {
      if (keycode == 0xff53) goto switchD_0012f111_caseD_3;
      goto code_r0x00130fb2;
    }
    goto switchD_0012f111_caseD_1;
  }
  if (keycode == 0xff54) goto switchD_0012f111_caseD_4;
  if (keycode == 0xffb0) goto switchD_0012f06f_caseD_ffb0;
  if (keycode == 0xffe4) goto switchD_0012f06f_caseD_ffe4;
code_r0x00130fb2:
  switch(keycode) {
  case 0xffaa:
    goto switchD_0012f06f_caseD_ffaa;
  case 0xffab:
switchD_0012f06f_caseD_ffab:
    this->_is_keyPADADD = pressed;
    goto LAB_00131155;
  default:
    goto switchD_0012f06f_caseD_ffac;
  case 0xffad:
    goto switchD_0012f06f_caseD_ffad;
  case 0xffaf:
    goto switchD_0012f06f_caseD_ffaf;
  case 0xffb1:
switchD_0012f06f_caseD_ffb1:
    this->_is_keyPAD1 = pressed;
code_r0x00130fd8:
    switch(keycode) {
    case 0xffaa:
      goto switchD_0012f06f_caseD_ffaa;
    case 0xffab:
      goto switchD_0012f06f_caseD_ffab;
    default:
      goto switchD_0012f06f_caseD_ffac;
    case 0xffad:
      goto switchD_0012f06f_caseD_ffad;
    case 0xffaf:
      goto switchD_0012f06f_caseD_ffaf;
    case 0xffb2:
      goto switchD_0012f06f_caseD_ffb2;
    case 0xffb3:
      goto switchD_0012f06f_caseD_ffb3;
    case 0xffb4:
      goto switchD_0012f06f_caseD_ffb4;
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    }
  case 0xffb2:
switchD_0012f06f_caseD_ffb2:
    this->_is_keyPAD2 = pressed;
code_r0x00130ffe:
    switch(keycode) {
    case 0xffaa:
      goto switchD_0012f06f_caseD_ffaa;
    case 0xffab:
      goto switchD_0012f06f_caseD_ffab;
    default:
      goto switchD_0012f06f_caseD_ffac;
    case 0xffad:
      goto switchD_0012f06f_caseD_ffad;
    case 0xffaf:
      goto switchD_0012f06f_caseD_ffaf;
    case 0xffb3:
      goto switchD_0012f06f_caseD_ffb3;
    case 0xffb4:
      goto switchD_0012f06f_caseD_ffb4;
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    }
  case 0xffb3:
switchD_0012f06f_caseD_ffb3:
    this->_is_keyPAD3 = pressed;
code_r0x00131024:
    switch(keycode) {
    case 0xffaa:
      goto switchD_0012f06f_caseD_ffaa;
    case 0xffab:
      goto switchD_0012f06f_caseD_ffab;
    default:
      goto switchD_0012f06f_caseD_ffac;
    case 0xffad:
      goto switchD_0012f06f_caseD_ffad;
    case 0xffaf:
      goto switchD_0012f06f_caseD_ffaf;
    case 0xffb4:
      goto switchD_0012f06f_caseD_ffb4;
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    }
  case 0xffb4:
switchD_0012f06f_caseD_ffb4:
    this->_is_keyPAD4 = pressed;
    switch(keycode) {
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    default:
      goto switchD_0013107e_default;
    }
  case 0xffb5:
switchD_0012f06f_caseD_ffb5:
    this->_is_keyPAD5 = pressed;
    switch(keycode) {
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    }
    goto switchD_0013107e_default;
  case 0xffb6:
switchD_0012f06f_caseD_ffb6:
    this->_is_keyPAD6 = pressed;
    if (0xffb7 < (int)keycode) {
      if (keycode == 0xffb8) goto switchD_0012f06f_caseD_ffb8;
      if (keycode != 0xffb9) goto LAB_00131155;
      goto switchD_0012f06f_caseD_ffb9;
    }
    if (keycode == 0xffab) goto switchD_0012f06f_caseD_ffab;
    if (keycode == 0xffb7) goto switchD_0012f06f_caseD_ffb7;
LAB_00131155:
    if (keycode == 0xffaa) {
switchD_0012f06f_caseD_ffaa:
      this->_is_keyPADMUL = pressed;
      if (keycode != 0xffaf) goto switchD_0012f06f_caseD_ffac;
    }
    else if (keycode != 0xffaf) {
      if (keycode != 0xffad) goto switchD_0012f06f_caseD_ffac;
switchD_0012f06f_caseD_ffad:
      this->_is_keyPADSUB = pressed;
LAB_00131176:
      if (keycode != 0xffaf) {
        if (keycode != 0xffaa) goto switchD_0012f06f_caseD_ffac;
        goto switchD_0012f06f_caseD_ffaa;
      }
    }
switchD_0012f06f_caseD_ffaf:
    this->_is_keyPADDIV = pressed;
switchD_0012f06f_caseD_ffac:
    if (pressed) {
      if (this->_keys[0] != 0) {
        memmove(this->_keys + 1,this->_keys,0x1fc);
      }
      this->_keys[0] = keycode;
      if (this->_released_keys[0] != 0) {
        memmove(this->_released_keys + 1,this->_released_keys,0x1fc);
        this->_released_keys[0] = 0;
      }
    }
    else {
      if (this->_keys[0] != 0) {
        memmove(this->_keys + 1,this->_keys,0x1fc);
        this->_keys[0] = 0;
      }
      if (this->_released_keys[0] != 0) {
        memmove(this->_released_keys + 1,this->_released_keys,0x1fc);
      }
      this->_released_keys[0] = keycode;
    }
    this->_is_event = keycode != 0;
    return this;
  case 0xffb7:
switchD_0012f06f_caseD_ffb7:
    this->_is_keyPAD7 = pressed;
    if (0xffb7 < (int)keycode) {
      if (keycode != 0xffb9) {
        if (keycode != 0xffb8) goto LAB_00131176;
        goto switchD_0012f06f_caseD_ffb8;
      }
      goto switchD_0012f06f_caseD_ffb9;
    }
    if (keycode == 0xffab) goto switchD_0012f06f_caseD_ffab;
    if (keycode == 0xffad) goto switchD_0012f06f_caseD_ffad;
    goto LAB_00131176;
  case 0xffb8:
switchD_0012f06f_caseD_ffb8:
    this->_is_keyPAD8 = pressed;
    goto switchD_00130230_caseD_ff55;
  case 0xffb9:
switchD_0012f06f_caseD_ffb9:
    this->_is_keyPAD9 = pressed;
switchD_0013107e_default:
    if (keycode - 0xffaa < 6) {
      pCVar1 = (CImgDisplay *)
               (*(code *)(&DAT_001705b0 + *(int *)(&DAT_001705b0 + (ulong)(keycode - 0xffaa) * 4)))
                         ();
      return pCVar1;
    }
    goto switchD_0012f06f_caseD_ffac;
  }
switchD_0012f160_caseD_75:
  this->_is_keyU = pressed;
  if (0xff55 < (int)keycode) {
    if (keycode != 0xff56) {
      if (keycode != 0xff57) goto LAB_0012fe43;
      goto switchD_0012f111_caseD_7;
    }
    goto switchD_0012f111_caseD_6;
  }
  if (keycode == 0x69) goto switchD_0012f160_caseD_69;
  if (keycode == 0x6f) goto switchD_0012f160_caseD_6f;
  if (keycode != 0x70) goto switchD_0012f852_caseD_66;
switchD_0012f160_caseD_70:
  this->_is_keyP = pressed;
switchD_0012fcfd_caseD_6a:
  if ((int)keycode < 0xff0d) {
    switch(keycode) {
    case 0x61:
switchD_0012f160_caseD_61:
      this->_is_keyA = pressed;
switchD_0012f570_caseD_62:
      if ((int)keycode < 0xff51) {
        switch(keycode) {
        case 0x62:
          goto switchD_0012f160_caseD_62;
        case 99:
          goto switchD_0012f160_caseD_63;
        case 100:
          goto switchD_0012f160_caseD_64;
        case 0x65:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          break;
        case 0x66:
          goto switchD_0012f160_caseD_66;
        case 0x67:
          goto switchD_0012f160_caseD_67;
        case 0x68:
          goto switchD_0012f160_caseD_68;
        case 0x6a:
          goto switchD_0012f160_caseD_6a;
        case 0x6b:
          goto switchD_0012f160_caseD_6b;
        case 0x6c:
          goto switchD_0012f160_caseD_6c;
        case 0x6d:
          goto switchD_0012f160_caseD_6d;
        case 0x6e:
          goto switchD_0012f160_caseD_6e;
        case 0x73:
          goto switchD_0012f160_caseD_73;
        case 0x76:
          goto switchD_0012f160_caseD_76;
        case 0x78:
          goto switchD_0012f160_caseD_78;
        case 0x7a:
          goto switchD_0012f160_caseD_7a;
        default:
          if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
          if (keycode == 0xff0d) goto LAB_001307c0;
        }
        goto code_r0x00130fd8;
      }
      if (0xffb0 < (int)keycode) {
        switch(keycode) {
        case 0xffe1:
          goto switchD_0012f06f_caseD_ffe1;
        case 0xffe2:
          goto switchD_0012f06f_caseD_ffe2;
        case 0xffe3:
          goto switchD_0012f06f_caseD_ffe3;
        case 0xffe4:
          goto switchD_0012f06f_caseD_ffe4;
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto code_r0x00130fd8;
        case 0xffe9:
          goto switchD_0012f06f_caseD_ffe9;
        case 0xffea:
          goto switchD_0012f06f_caseD_ffea;
        case 0xffeb:
          goto switchD_0012f06f_caseD_ffeb;
        case 0xffec:
          goto switchD_0012f06f_caseD_ffec;
        default:
          if (keycode != 0xffb1) goto code_r0x00130fd8;
          goto switchD_0012f06f_caseD_ffb1;
        }
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0012f111_caseD_1;
      case 0xff52:
        goto switchD_0012f111_caseD_2;
      case 0xff53:
        goto switchD_0012f111_caseD_3;
      case 0xff54:
        goto switchD_0012f111_caseD_4;
      default:
        if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
        if (keycode != 0xffb0) goto code_r0x00130fd8;
        goto switchD_0012f06f_caseD_ffb0;
      }
    case 0x62:
      goto switchD_0012f160_caseD_62;
    case 99:
      goto switchD_0012f160_caseD_63;
    case 100:
switchD_0012f160_caseD_64:
      this->_is_keyD = pressed;
      switch(keycode) {
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x69:
        goto switchD_00130384_caseD_69;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      case 0x6b:
        goto switchD_0012f160_caseD_6b;
      case 0x6c:
        goto switchD_0012f160_caseD_6c;
      default:
        if (keycode != 0xff0d) goto switchD_00130384_caseD_69;
        goto LAB_001307c0;
      }
    case 0x65:
    case 0x69:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x79:
      goto switchD_0012f1e5_caseD_ffe6;
    case 0x66:
switchD_0012f160_caseD_66:
      this->_is_keyF = pressed;
switchD_0012f8e9_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe1:
            goto switchD_0012f06f_caseD_ffe1;
          case 0xffe2:
            goto switchD_0012f06f_caseD_ffe2;
          case 0xffe3:
            goto switchD_0012f06f_caseD_ffe3;
          case 0xffe4:
            goto switchD_0012f06f_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffea:
            goto switchD_0012f06f_caseD_ffea;
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffeb;
          case 0xffec:
            goto switchD_0012f06f_caseD_ffec;
          }
          goto switchD_00130cb0_default;
        }
      }
      if (0xff0c < (int)keycode) {
        switch(keycode) {
        case 0xff51:
          goto switchD_0012f111_caseD_1;
        case 0xff52:
          goto switchD_0012f111_caseD_2;
        case 0xff53:
          goto switchD_0012f111_caseD_3;
        case 0xff54:
          goto switchD_0012f111_caseD_4;
        }
        goto switchD_001307b1_default;
      }
      switch(keycode) {
      case 0x62:
        goto switchD_0012f160_caseD_62;
      case 99:
        goto switchD_0012f160_caseD_63;
      case 100:
      case 0x65:
      case 0x66:
      case 0x69:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x77:
      case 0x79:
        goto switchD_0012f06f_caseD_ffac;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      case 0x6b:
        goto switchD_0012f160_caseD_6b;
      case 0x6c:
        goto switchD_0012f160_caseD_6c;
      case 0x6d:
        goto switchD_0012f160_caseD_6d;
      case 0x6e:
        goto switchD_0012f160_caseD_6e;
      case 0x76:
        goto switchD_0012f160_caseD_76;
      case 0x78:
        goto switchD_0012f160_caseD_78;
      case 0x7a:
        goto switchD_0012f160_caseD_7a;
      }
      goto switchD_0013048f_default;
    case 0x67:
switchD_0012f160_caseD_67:
      this->_is_keyG = pressed;
      break;
    case 0x68:
switchD_0012f160_caseD_68:
      this->_is_keyH = pressed;
switchD_0012fa82_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe1:
            goto switchD_0012f06f_caseD_ffe1;
          case 0xffe2:
            goto switchD_0012f06f_caseD_ffe2;
          case 0xffe3:
            goto switchD_0012f06f_caseD_ffe3;
          case 0xffe4:
            goto switchD_0012f06f_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffea:
            goto switchD_0012f06f_caseD_ffea;
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffeb;
          case 0xffec:
            goto switchD_0012f06f_caseD_ffec;
          }
          goto switchD_00130cb0_default;
        }
      }
      if ((int)keycode < 0xff0d) {
        switch(keycode) {
        case 0x62:
          goto switchD_0012f160_caseD_62;
        case 99:
          goto switchD_0012f160_caseD_63;
        case 100:
        case 0x65:
        case 0x66:
        case 0x67:
        case 0x68:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          goto switchD_0012f06f_caseD_ffac;
        case 0x6a:
          goto switchD_0012f160_caseD_6a;
        case 0x6b:
          goto switchD_0012f160_caseD_6b;
        case 0x6c:
          goto switchD_0012f160_caseD_6c;
        case 0x6d:
          goto switchD_0012f160_caseD_6d;
        case 0x6e:
          goto switchD_0012f160_caseD_6e;
        case 0x76:
          goto switchD_0012f160_caseD_76;
        case 0x78:
          goto switchD_0012f160_caseD_78;
        case 0x7a:
          goto switchD_0012f160_caseD_7a;
        default:
          goto switchD_0013048f_default;
        }
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0012f111_caseD_1;
      case 0xff52:
        goto switchD_0012f111_caseD_2;
      case 0xff53:
        goto switchD_0012f111_caseD_3;
      case 0xff54:
        goto switchD_0012f111_caseD_4;
      }
      goto switchD_001307b1_default;
    case 0x6a:
switchD_0012f160_caseD_6a:
      this->_is_keyJ = pressed;
switchD_0013029f_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0012f06f_caseD_ffaa;
        case 0xffab:
          goto switchD_0012f06f_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0012f06f_caseD_ffac;
        case 0xffad:
          goto switchD_0012f06f_caseD_ffad;
        case 0xffaf:
          goto switchD_0012f06f_caseD_ffaf;
        case 0xffb0:
          goto switchD_0012f06f_caseD_ffb0;
        case 0xffb1:
          goto switchD_0012f06f_caseD_ffb1;
        case 0xffb2:
          goto switchD_0012f06f_caseD_ffb2;
        case 0xffb3:
          goto switchD_0012f06f_caseD_ffb3;
        case 0xffb4:
          goto switchD_0012f06f_caseD_ffb4;
        case 0xffb5:
          goto switchD_0012f06f_caseD_ffb5;
        case 0xffb6:
          goto switchD_0012f06f_caseD_ffb6;
        case 0xffb7:
          goto switchD_0012f06f_caseD_ffb7;
        case 0xffb8:
          goto switchD_0012f06f_caseD_ffb8;
        case 0xffb9:
          goto switchD_0012f06f_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe1:
            goto switchD_0012f06f_caseD_ffe1;
          case 0xffe2:
            goto switchD_0012f06f_caseD_ffe2;
          case 0xffe3:
            goto switchD_0012f06f_caseD_ffe3;
          case 0xffe4:
            goto switchD_0012f06f_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0012f06f_caseD_ffac;
          case 0xffe9:
            goto switchD_0012f06f_caseD_ffe9;
          case 0xffea:
            goto switchD_0012f06f_caseD_ffea;
          case 0xffeb:
            goto switchD_0012f06f_caseD_ffeb;
          case 0xffec:
            goto switchD_0012f06f_caseD_ffec;
          }
          goto switchD_00130cb0_default;
        }
      }
      if (0x6a < (int)keycode) {
        switch(keycode) {
        case 0x6b:
          goto switchD_0012f160_caseD_6b;
        case 0x6c:
          goto switchD_0012f160_caseD_6c;
        case 0x6d:
          goto switchD_0012f160_caseD_6d;
        case 0x6e:
          goto switchD_0012f160_caseD_6e;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          goto switchD_0012f06f_caseD_ffac;
        case 0x76:
          goto switchD_0012f160_caseD_76;
        case 0x78:
          goto switchD_0012f160_caseD_78;
        case 0x7a:
          goto switchD_0012f160_caseD_7a;
        default:
          switch(keycode) {
          case 0xff51:
            goto switchD_0012f111_caseD_1;
          case 0xff52:
            goto switchD_0012f111_caseD_2;
          case 0xff53:
            goto switchD_0012f111_caseD_3;
          case 0xff54:
            goto switchD_0012f111_caseD_4;
          }
          goto switchD_001307b1_default;
        }
      }
      goto LAB_001307f7;
    case 0x6b:
switchD_0012f160_caseD_6b:
      this->_is_keyK = pressed;
      if ((int)keycode < 0x7a) {
        if (keycode != 99) {
          if (keycode == 0x6c) goto switchD_0012f160_caseD_6c;
          if (keycode != 0x78) goto LAB_00130907;
          goto switchD_0012f160_caseD_78;
        }
        goto switchD_0012f160_caseD_63;
      }
      if (keycode == 0x7a) goto switchD_0012f160_caseD_7a;
      if (keycode == 0xff0d) goto LAB_001307c0;
      if (keycode == 0xffe1) goto switchD_0012f06f_caseD_ffe1;
      goto LAB_00130907;
    case 0x6c:
switchD_0012f160_caseD_6c:
      this->_is_keyL = pressed;
switchD_00130361_caseD_65:
      if ((int)keycode < 0xff67) {
        if (0x79 < (int)keycode) {
          if (keycode - 0xff51 < 4) {
            pCVar1 = (CImgDisplay *)
                     (*(code *)(&DAT_0016ff08 +
                               *(int *)(&DAT_0016ff08 + (ulong)(keycode - 0xff51) * 4)))();
            return pCVar1;
          }
          if (keycode != 0x7a) goto switchD_001307b1_default;
          goto switchD_0012f160_caseD_7a;
        }
        if ((int)keycode < 0x6d) goto LAB_001307f7;
        if (0x75 < (int)keycode) {
          if (keycode != 0x76) {
            if (keycode != 0x78) goto switchD_0012f06f_caseD_ffac;
            goto switchD_0012f160_caseD_78;
          }
          goto switchD_0012f160_caseD_76;
        }
        if (keycode == 0x6d) goto switchD_0012f160_caseD_6d;
        goto switchD_00130a6f_default;
      }
      if (keycode - 0xffaa < 0x10) {
        pCVar1 = (CImgDisplay *)
                 (*(code *)(&DAT_0016ff18 + *(int *)(&DAT_0016ff18 + (ulong)(keycode - 0xffaa) * 4))
                 )();
        return pCVar1;
      }
      if (keycode - 0xffe1 < 0xc) {
        pCVar1 = (CImgDisplay *)
                 (*(code *)(&DAT_0016ff58 + *(int *)(&DAT_0016ff58 + (ulong)(keycode - 0xffe1) * 4))
                 )();
        return pCVar1;
      }
      goto switchD_00130cb0_default;
    case 0x6d:
      goto switchD_0012f160_caseD_6d;
    case 0x6e:
      goto switchD_0012f160_caseD_6e;
    case 0x73:
switchD_0012f160_caseD_73:
      this->_is_keyS = pressed;
      switch(keycode) {
      case 100:
        goto switchD_0012f160_caseD_64;
      default:
        goto switchD_00130361_caseD_65;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      case 0x6b:
        goto switchD_0012f160_caseD_6b;
      case 0x6c:
        goto switchD_0012f160_caseD_6c;
      }
    case 0x76:
      goto switchD_0012f160_caseD_76;
    case 0x78:
      goto switchD_0012f160_caseD_78;
    case 0x7a:
      goto switchD_0012f160_caseD_7a;
    default:
switchD_0012f160_default:
      if (keycode != 0x20) goto switchD_0012f1e5_caseD_ffe6;
      goto switchD_0012f0d2_caseD_20;
    }
    goto LAB_001303e5;
  }
  if (0xff66 < (int)keycode) {
    switch(keycode) {
    case 0xffe1:
      goto switchD_0012f06f_caseD_ffe1;
    case 0xffe2:
      goto switchD_0012f06f_caseD_ffe2;
    case 0xffe3:
      goto switchD_0012f06f_caseD_ffe3;
    case 0xffe4:
      goto switchD_0012f06f_caseD_ffe4;
    case 0xffe5:
switchD_0012f06f_caseD_ffe5:
      this->_is_keyCAPSLOCK = pressed;
      switch(keycode) {
      case 0x61:
        goto switchD_0012f160_caseD_61;
      case 0x62:
      case 99:
      case 0x65:
      case 0x69:
        break;
      case 100:
        goto switchD_0012f160_caseD_64;
      case 0x66:
        goto switchD_0012f160_caseD_66;
      case 0x67:
        goto switchD_0012f160_caseD_67;
      case 0x68:
        goto switchD_0012f160_caseD_68;
      case 0x6a:
        goto switchD_0012f160_caseD_6a;
      default:
        if (keycode == 0x73) goto switchD_0012f160_caseD_73;
      }
      goto switchD_0013029f_caseD_62;
    case 0xffe6:
    case 0xffe7:
    case 0xffe8:
      goto switchD_0012f1e5_caseD_ffe6;
    case 0xffe9:
      goto switchD_0012f06f_caseD_ffe9;
    case 0xffea:
      goto switchD_0012f06f_caseD_ffea;
    case 0xffeb:
      goto switchD_0012f06f_caseD_ffeb;
    case 0xffec:
      goto switchD_0012f06f_caseD_ffec;
    default:
switchD_0012f1e5_default:
      if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
      if (keycode != 0xffff) goto switchD_0012f1e5_caseD_ffe6;
switchD_0012f06f_caseD_ffff:
      this->_is_keyDELETE = pressed;
switchD_0012fd79_caseD_6a:
      if ((int)keycode < 0xff51) {
        switch(keycode) {
        case 0x61:
          goto switchD_0012f160_caseD_61;
        case 0x62:
          goto switchD_0012f160_caseD_62;
        case 99:
          goto switchD_0012f160_caseD_63;
        case 100:
          goto switchD_0012f160_caseD_64;
        case 0x65:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          break;
        case 0x66:
          goto switchD_0012f160_caseD_66;
        case 0x67:
          goto switchD_0012f160_caseD_67;
        case 0x68:
          goto switchD_0012f160_caseD_68;
        case 0x6a:
          goto switchD_0012f160_caseD_6a;
        case 0x6b:
          goto switchD_0012f160_caseD_6b;
        case 0x6c:
          goto switchD_0012f160_caseD_6c;
        case 0x6d:
          goto switchD_0012f160_caseD_6d;
        case 0x6e:
          goto switchD_0012f160_caseD_6e;
        case 0x73:
          goto switchD_0012f160_caseD_73;
        case 0x76:
          goto switchD_0012f160_caseD_76;
        case 0x78:
          goto switchD_0012f160_caseD_78;
        case 0x7a:
          goto switchD_0012f160_caseD_7a;
        default:
          if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
          if (keycode == 0xff0d) goto LAB_001307c0;
        }
      }
      else {
        switch(keycode) {
        case 0xffe1:
          goto switchD_0012f06f_caseD_ffe1;
        case 0xffe2:
          goto switchD_0012f06f_caseD_ffe2;
        case 0xffe3:
          goto switchD_0012f06f_caseD_ffe3;
        case 0xffe4:
          goto switchD_0012f06f_caseD_ffe4;
        case 0xffe5:
          goto switchD_0012f06f_caseD_ffe5;
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          break;
        case 0xffe9:
          goto switchD_0012f06f_caseD_ffe9;
        case 0xffea:
          goto switchD_0012f06f_caseD_ffea;
        case 0xffeb:
          goto switchD_0012f06f_caseD_ffeb;
        case 0xffec:
          goto switchD_0012f06f_caseD_ffec;
        default:
          switch(keycode) {
          case 0xff51:
            goto switchD_0012f111_caseD_1;
          case 0xff52:
            goto switchD_0012f111_caseD_2;
          case 0xff53:
          case 0xff54:
          case 0xff55:
            break;
          case 0xff56:
            goto switchD_0012f111_caseD_6;
          case 0xff57:
            goto switchD_0012f111_caseD_7;
          default:
            if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
          }
        }
      }
    }
    goto code_r0x00130f21;
  }
LAB_0013000c:
  if ((int)keycode < 0xff56) {
    if (keycode == 0xff0d) goto LAB_001307c0;
    if (keycode != 0xff52) goto switchD_0012f1e5_caseD_ffe6;
    goto switchD_0012f111_caseD_2;
  }
  if (keycode == 0xff56) {
switchD_0012f111_caseD_6:
    this->_is_keyPAGEDOWN = pressed;
switchD_0012f852_caseD_66:
    if ((int)keycode < 0xff51) {
      if (keycode - 0x61 < 0x1a) {
        pCVar1 = (CImgDisplay *)
                 (*(code *)(&DAT_0016f9e8 + *(int *)(&DAT_0016f9e8 + (ulong)(keycode - 0x61) * 4)))
                           ();
        return pCVar1;
      }
      if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
      if (keycode == 0xff0d) goto LAB_001307c0;
    }
    else {
      if (keycode - 0xffe1 < 0xc) {
        pCVar1 = (CImgDisplay *)
                 (*(code *)(&DAT_0016fa60 + *(int *)(&DAT_0016fa60 + (ulong)(keycode - 0xffe1) * 4))
                 )();
        return pCVar1;
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0012f111_caseD_1;
      case 0xff52:
        goto switchD_0012f111_caseD_2;
      case 0xff53:
        goto switchD_0012f111_caseD_3;
      case 0xff54:
        goto switchD_0012f111_caseD_4;
      default:
        if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
      }
    }
    goto code_r0x00130f8c;
  }
  if (keycode != 0xff57) goto switchD_0012f1e5_caseD_ffe6;
switchD_0012f111_caseD_7:
  this->_is_keyEND = pressed;
LAB_001301a7:
  if ((int)keycode < 0xff67) {
    if ((int)keycode < 0xff0d) {
      if (keycode - 0x61 < 0x1a) {
        pCVar1 = (CImgDisplay *)
                 (*(code *)(&DAT_0016f914 + *(int *)(&DAT_0016f914 + (ulong)(keycode - 0x61) * 4)))
                           ();
        return pCVar1;
      }
      if (keycode == 0x20) goto switchD_0012f0d2_caseD_20;
    }
    else {
      switch(keycode) {
      case 0xff51:
        goto switchD_0012f111_caseD_1;
      case 0xff52:
        goto switchD_0012f111_caseD_2;
      case 0xff53:
        goto switchD_0012f111_caseD_3;
      case 0xff54:
        goto switchD_0012f111_caseD_4;
      case 0xff55:
        break;
      case 0xff56:
        goto switchD_0012f111_caseD_6;
      default:
        if (keycode == 0xff0d) goto LAB_001307c0;
      }
    }
  }
  else {
    if (keycode - 0xffb0 < 9) {
      pCVar1 = (CImgDisplay *)
               (*(code *)(&DAT_0016f994 + *(int *)(&DAT_0016f994 + (ulong)(keycode - 0xffb0) * 4)))
                         ();
      return pCVar1;
    }
    if (keycode - 0xffe1 < 0xc) {
      pCVar1 = (CImgDisplay *)
               (*(code *)(&DAT_0016f9b8 + *(int *)(&DAT_0016f9b8 + (ulong)(keycode - 0xffe1) * 4)))
                         ();
      return pCVar1;
    }
    if (keycode == 0xff67) goto switchD_0012f111_caseD_17;
  }
switchD_00130230_caseD_ff55:
  if (keycode - 0xffaa < 6) {
    pCVar1 = (CImgDisplay *)
             (*(code *)(&DAT_00170598 + *(int *)(&DAT_00170598 + (ulong)(keycode - 0xffaa) * 4)))();
    return pCVar1;
  }
  if (keycode != 0xffb9) goto switchD_0012f06f_caseD_ffac;
  goto switchD_0012f06f_caseD_ffb9;
switchD_0012f06f_caseD_ffec:
  this->_is_keyAPPRIGHT = pressed;
switchD_0012ff2f_caseD_65:
  if (0xff66 < (int)keycode) {
    switch(keycode) {
    case 0xffaa:
      goto switchD_0012f06f_caseD_ffaa;
    case 0xffab:
      goto switchD_0012f06f_caseD_ffab;
    case 0xffac:
    case 0xffae:
      goto switchD_0012f06f_caseD_ffac;
    case 0xffad:
      goto switchD_0012f06f_caseD_ffad;
    case 0xffaf:
      goto switchD_0012f06f_caseD_ffaf;
    case 0xffb0:
switchD_0012f06f_caseD_ffb0:
      this->_is_keyPAD0 = pressed;
      goto code_r0x00130fb2;
    case 0xffb1:
      goto switchD_0012f06f_caseD_ffb1;
    case 0xffb2:
      goto switchD_0012f06f_caseD_ffb2;
    case 0xffb3:
      goto switchD_0012f06f_caseD_ffb3;
    case 0xffb4:
      goto switchD_0012f06f_caseD_ffb4;
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    default:
      if (keycode == 0xffe4) goto switchD_0012f06f_caseD_ffe4;
      goto switchD_00130cb0_default;
    }
  }
LAB_00130eed:
  if (keycode == 0xff51) {
switchD_0012f111_caseD_1:
    this->_is_keyARROWLEFT = pressed;
code_r0x00130f21:
    switch(keycode) {
    case 0xffaa:
      goto switchD_0012f06f_caseD_ffaa;
    case 0xffab:
      goto switchD_0012f06f_caseD_ffab;
    case 0xffac:
    case 0xffae:
      goto switchD_0012f06f_caseD_ffac;
    case 0xffad:
      goto switchD_0012f06f_caseD_ffad;
    case 0xffaf:
      goto switchD_0012f06f_caseD_ffaf;
    case 0xffb0:
      goto switchD_0012f06f_caseD_ffb0;
    case 0xffb1:
      goto switchD_0012f06f_caseD_ffb1;
    case 0xffb2:
      goto switchD_0012f06f_caseD_ffb2;
    case 0xffb3:
      goto switchD_0012f06f_caseD_ffb3;
    case 0xffb4:
      goto switchD_0012f06f_caseD_ffb4;
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    }
  }
switchD_00130f2f_default:
  if (keycode == 0xff53) {
switchD_0012f111_caseD_3:
    this->_is_keyARROWRIGHT = pressed;
code_r0x00130f8c:
    switch(keycode) {
    case 0xffaa:
      goto switchD_0012f06f_caseD_ffaa;
    case 0xffab:
      goto switchD_0012f06f_caseD_ffab;
    default:
      goto switchD_0012f06f_caseD_ffac;
    case 0xffad:
      goto switchD_0012f06f_caseD_ffad;
    case 0xffaf:
      goto switchD_0012f06f_caseD_ffaf;
    case 0xffb0:
      goto switchD_0012f06f_caseD_ffb0;
    case 0xffb1:
      goto switchD_0012f06f_caseD_ffb1;
    case 0xffb2:
      goto switchD_0012f06f_caseD_ffb2;
    case 0xffb3:
      goto switchD_0012f06f_caseD_ffb3;
    case 0xffb4:
      goto switchD_0012f06f_caseD_ffb4;
    case 0xffb5:
      goto switchD_0012f06f_caseD_ffb5;
    case 0xffb6:
      goto switchD_0012f06f_caseD_ffb6;
    case 0xffb7:
      goto switchD_0012f06f_caseD_ffb7;
    case 0xffb8:
      goto switchD_0012f06f_caseD_ffb8;
    case 0xffb9:
      goto switchD_0012f06f_caseD_ffb9;
    }
  }
  if (keycode != 0xff54) goto switchD_0012f06f_caseD_ffac;
switchD_0012f111_caseD_4:
  this->_is_keyARROWDOWN = pressed;
  switch(keycode) {
  case 0xffb0:
    goto switchD_0012f06f_caseD_ffb0;
  case 0xffb1:
    goto switchD_0012f06f_caseD_ffb1;
  case 0xffb2:
    goto switchD_0012f06f_caseD_ffb2;
  case 0xffb3:
    goto switchD_0012f06f_caseD_ffb3;
  }
  if (keycode == 0xff53) goto switchD_0012f111_caseD_3;
  goto code_r0x00131024;
}

Assistant:

CImgDisplay& set_key(const unsigned int keycode, const bool pressed=true) {
#define _cimg_set_key(k) if (keycode==cimg::key##k) _is_key##k = pressed;
      _cimg_set_key(ESC); _cimg_set_key(F1); _cimg_set_key(F2); _cimg_set_key(F3);
      _cimg_set_key(F4); _cimg_set_key(F5); _cimg_set_key(F6); _cimg_set_key(F7);
      _cimg_set_key(F8); _cimg_set_key(F9); _cimg_set_key(F10); _cimg_set_key(F11);
      _cimg_set_key(F12); _cimg_set_key(PAUSE); _cimg_set_key(1); _cimg_set_key(2);
      _cimg_set_key(3); _cimg_set_key(4); _cimg_set_key(5); _cimg_set_key(6);
      _cimg_set_key(7); _cimg_set_key(8); _cimg_set_key(9); _cimg_set_key(0);
      _cimg_set_key(BACKSPACE); _cimg_set_key(INSERT); _cimg_set_key(HOME);
      _cimg_set_key(PAGEUP); _cimg_set_key(TAB); _cimg_set_key(Q); _cimg_set_key(W);
      _cimg_set_key(E); _cimg_set_key(R); _cimg_set_key(T); _cimg_set_key(Y);
      _cimg_set_key(U); _cimg_set_key(I); _cimg_set_key(O); _cimg_set_key(P);
      _cimg_set_key(DELETE); _cimg_set_key(END); _cimg_set_key(PAGEDOWN);
      _cimg_set_key(CAPSLOCK); _cimg_set_key(A); _cimg_set_key(S); _cimg_set_key(D);
      _cimg_set_key(F); _cimg_set_key(G); _cimg_set_key(H); _cimg_set_key(J);
      _cimg_set_key(K); _cimg_set_key(L); _cimg_set_key(ENTER);
      _cimg_set_key(SHIFTLEFT); _cimg_set_key(Z); _cimg_set_key(X); _cimg_set_key(C);
      _cimg_set_key(V); _cimg_set_key(B); _cimg_set_key(N); _cimg_set_key(M);
      _cimg_set_key(SHIFTRIGHT); _cimg_set_key(ARROWUP); _cimg_set_key(CTRLLEFT);
      _cimg_set_key(APPLEFT); _cimg_set_key(ALT); _cimg_set_key(SPACE); _cimg_set_key(ALTGR);
      _cimg_set_key(APPRIGHT); _cimg_set_key(MENU); _cimg_set_key(CTRLRIGHT);
      _cimg_set_key(ARROWLEFT); _cimg_set_key(ARROWDOWN); _cimg_set_key(ARROWRIGHT);
      _cimg_set_key(PAD0); _cimg_set_key(PAD1); _cimg_set_key(PAD2);
      _cimg_set_key(PAD3); _cimg_set_key(PAD4); _cimg_set_key(PAD5);
      _cimg_set_key(PAD6); _cimg_set_key(PAD7); _cimg_set_key(PAD8);
      _cimg_set_key(PAD9); _cimg_set_key(PADADD); _cimg_set_key(PADSUB);
      _cimg_set_key(PADMUL); _cimg_set_key(PADDIV);
      if (pressed) {
        if (*_keys)
          std::memmove((void*)(_keys+1),(void*)_keys,sizeof(_keys) - sizeof(unsigned int));
        *_keys = keycode;
        if (*_released_keys) {
          std::memmove((void*)(_released_keys+1),(void*)_released_keys,sizeof(_released_keys) - sizeof(unsigned int));
          *_released_keys = 0;
        }
      } else {
        if (*_keys) {
          std::memmove((void*)(_keys+1),(void*)_keys,sizeof(_keys) - sizeof(unsigned int));
          *_keys = 0;
        }
        if (*_released_keys)
          std::memmove((void*)(_released_keys+1),(void*)_released_keys,sizeof(_released_keys) - sizeof(unsigned int));
        *_released_keys = keycode;
      }
      _is_event = keycode?true:false;
      return *this;
    }